

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O1

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  uint64_t uVar1;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  uint64_t uVar347;
  secp256k1_modinv64_modinfo *psVar348;
  ulong uVar349;
  secp256k1_gej *psVar350;
  secp256k1_gej *psVar351;
  byte bVar352;
  bool bVar353;
  byte bVar354;
  uint uVar355;
  int iVar356;
  ulong uVar357;
  secp256k1_modinv64_modinfo *modinfo;
  uint uVar358;
  int iVar359;
  ulong uVar360;
  ulong uVar361;
  ulong uVar362;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  secp256k1_modinv64_modinfo *extraout_RDX_02;
  secp256k1_gej *extraout_RDX_03;
  long lVar363;
  long lVar364;
  secp256k1_gej *a;
  int iVar365;
  secp256k1_gej *psVar366;
  ulong uVar367;
  secp256k1_gej *psVar368;
  secp256k1_modinv64_modinfo *unaff_RBP;
  ulong uVar369;
  secp256k1_gej *psVar370;
  secp256k1_gej *psVar371;
  secp256k1_gej *psVar372;
  secp256k1_modinv64_modinfo *psVar373;
  long lVar374;
  uint64_t *puVar375;
  long lVar376;
  secp256k1_gej *psVar377;
  uint64_t *puVar378;
  secp256k1_gej *psVar379;
  int iVar380;
  undefined1 *puVar381;
  secp256k1_gej *psVar382;
  long lVar383;
  secp256k1_gej *psVar384;
  secp256k1_gej *psVar385;
  secp256k1_gej *psVar386;
  secp256k1_gej *psVar387;
  secp256k1_gej *psVar388;
  secp256k1_fe *b;
  secp256k1_modinv64_modinfo *psVar389;
  secp256k1_modinv64_modinfo *psVar390;
  secp256k1_modinv64_modinfo *psVar391;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 d;
  secp256k1_modinv64_signed62 e;
  secp256k1_fe tmp;
  secp256k1_ge sStack_928;
  secp256k1_ge sStack_8c0;
  secp256k1_gej sStack_858;
  secp256k1_gej *psStack_7c0;
  secp256k1_gej *psStack_7b8;
  secp256k1_gej *psStack_7b0;
  secp256k1_gej *psStack_7a8;
  secp256k1_gej *psStack_7a0;
  secp256k1_gej *psStack_798;
  secp256k1_gej *psStack_790;
  secp256k1_gej *psStack_788;
  secp256k1_gej *psStack_780;
  secp256k1_gej *psStack_778;
  secp256k1_gej *psStack_770;
  undefined1 auStack_768 [56];
  ulong uStack_730;
  secp256k1_gej *psStack_728;
  secp256k1_gej *psStack_720;
  ulong uStack_718;
  ulong uStack_710;
  undefined1 auStack_708 [56];
  uint64_t uStack_6d0;
  uint64_t uStack_6c8;
  uint64_t uStack_6c0;
  uint64_t uStack_6b8;
  int iStack_6b0;
  undefined1 auStack_6a8 [56];
  uint64_t uStack_670;
  uint64_t uStack_668;
  uint64_t uStack_660;
  uint64_t uStack_658;
  int iStack_650;
  undefined1 auStack_648 [72];
  uint64_t uStack_600;
  uint64_t uStack_5f8;
  long lStack_5f0;
  uint64_t uStack_5e8;
  int iStack_5e0;
  undefined1 auStack_5d8 [64];
  ulong uStack_598;
  ulong uStack_590;
  ulong uStack_588;
  long lStack_580;
  uint64_t uStack_578;
  secp256k1_fe sStack_570;
  secp256k1_gej *psStack_540;
  secp256k1_gej *psStack_538;
  secp256k1_gej *psStack_530;
  secp256k1_fe *psStack_528;
  secp256k1_gej *psStack_520;
  secp256k1_gej *psStack_518;
  ulong uStack_508;
  secp256k1_gej *psStack_500;
  ulong uStack_4f8;
  undefined1 auStack_4f0 [56];
  uint64_t uStack_4b8;
  uint64_t uStack_4b0;
  uint64_t uStack_4a8;
  uint64_t uStack_4a0;
  int iStack_498;
  int iStack_494;
  secp256k1_gej *psStack_488;
  secp256k1_gej *psStack_480;
  secp256k1_gej *psStack_478;
  secp256k1_gej *psStack_470;
  secp256k1_gej *psStack_468;
  secp256k1_gej *psStack_460;
  uint uStack_454;
  ulong uStack_450;
  secp256k1_gej *psStack_448;
  undefined1 auStack_440 [48];
  ulong auStack_410 [5];
  undefined1 auStack_3e8 [56];
  secp256k1_gej *psStack_3b0;
  secp256k1_gej *psStack_3a8;
  secp256k1_gej *psStack_3a0;
  undefined1 auStack_398 [96];
  secp256k1_gej *psStack_338;
  secp256k1_gej *psStack_328;
  ulong uStack_320;
  ulong uStack_318;
  ulong uStack_310;
  secp256k1_fe sStack_308;
  secp256k1_gej *psStack_2d8;
  secp256k1_gej *psStack_2d0;
  secp256k1_gej *psStack_2c8;
  secp256k1_gej *psStack_2c0;
  secp256k1_gej *psStack_2b8;
  secp256k1_gej *psStack_2b0;
  uchar auStack_2a4 [4];
  undefined1 auStack_2a0 [144];
  secp256k1_gej *psStack_210;
  secp256k1_gej *psStack_208;
  long lStack_200;
  long lStack_1f8;
  long lStack_1f0;
  secp256k1_gej *psStack_1e8;
  secp256k1_gej *psStack_1e0;
  secp256k1_gej *psStack_1d8;
  secp256k1_gej *psStack_1d0;
  secp256k1_modinv64_modinfo *psStack_1c8;
  secp256k1_gej *psStack_1c0;
  ulong uStack_1b8;
  uint local_1ac;
  undefined1 local_1a8 [96];
  undefined1 local_148 [56];
  ulong auStack_110 [5];
  secp256k1_modinv64_trans2x2 local_e8;
  secp256k1_gej local_c8;
  
  bVar354 = 0;
  psStack_1c0 = (secp256k1_gej *)0x1227df;
  local_1a8._80_8_ = r;
  secp256k1_fe_verify(x);
  local_1a8._56_8_ = 0x1000003d1;
  uVar357 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar369 = (uVar357 >> 0x34) + x->n[1];
  uVar360 = (uVar369 >> 0x34) + x->n[2];
  uVar361 = (uVar360 >> 0x34) + x->n[3];
  uVar362 = (uVar361 >> 0x34) + (x->n[4] & 0xffffffffffff);
  local_1a8._72_8_ = (uVar369 | uVar357 | uVar360 | uVar361) & 0xfffffffffffff | uVar362;
  local_1a8._64_8_ =
       (uVar357 ^ 0x1000003d0) & uVar369 & uVar360 & uVar361 & (uVar362 ^ 0xf000000000000);
  psStack_1c0 = (secp256k1_gej *)0x122859;
  secp256k1_fe_verify(x);
  local_c8.z.n[0] = x->n[0];
  local_c8.z.n[1] = x->n[1];
  local_c8.z.n[2] = x->n[2];
  local_c8.z.n[3] = x->n[3];
  local_c8.z.n[4] = x->n[4];
  local_c8.z.magnitude = x->magnitude;
  local_c8.z.normalized = x->normalized;
  psStack_1c0 = (secp256k1_gej *)0x122888;
  local_1a8._48_8_ = x;
  secp256k1_fe_normalize_var(&local_c8.z);
  local_148._0_8_ = (local_c8.z.n[1] << 0x34 | local_c8.z.n[0]) & 0x3fffffffffffffff;
  local_148._8_8_ = (ulong)((uint)local_c8.z.n[2] & 0xfffff) << 0x2a | local_c8.z.n[1] >> 10;
  local_148._16_8_ = (ulong)((uint)local_c8.z.n[3] & 0x3fffffff) << 0x20 | local_c8.z.n[2] >> 0x14;
  local_148._24_8_ = (local_c8.z.n[4] & 0xffffffffff) << 0x16 | local_c8.z.n[3] >> 0x1e;
  local_148._32_8_ = local_c8.z.n[4] >> 0x28;
  psVar389 = (secp256k1_modinv64_modinfo *)0x0;
  local_c8.x.n[4] = 0;
  local_c8.x.n[2] = 0;
  local_c8.x.n[3] = 0;
  local_c8.x.n[0] = 0;
  local_c8.x.n[1] = 0;
  local_c8.y.n[1] = 0;
  local_c8.y.n[4] = 0;
  local_c8.y.n[2] = 0;
  local_c8.y.n[3] = 0;
  local_c8.y.n[0] = 1;
  local_1a8._16_8_ = 0;
  local_1a8._24_8_ = 0;
  local_1a8._0_8_ = -0x1000003d1;
  local_1a8._8_8_ = 0;
  local_1a8._32_8_ = 0x100;
  psVar387 = (secp256k1_gej *)0xffffffffffffffff;
  psVar366 = (secp256k1_gej *)0x5;
  local_148._48_8_ = local_148._0_8_;
  auStack_110[0] = local_148._8_8_;
  auStack_110[1] = local_148._16_8_;
  auStack_110[2] = local_148._24_8_;
  auStack_110[3] = local_148._32_8_;
  do {
    psVar385 = (secp256k1_gej *)local_1a8._0_8_;
    local_1ac = (uint)psVar366;
    psVar348 = (secp256k1_modinv64_modinfo *)0x0;
    psVar372 = (secp256k1_gej *)0x0;
    psVar373 = (secp256k1_modinv64_modinfo *)0x1;
    uVar358 = 0x3e;
    psVar370 = (secp256k1_gej *)0x1;
    puVar381 = (undefined1 *)local_148._48_8_;
    psVar386 = (secp256k1_gej *)local_1a8._0_8_;
    psVar391 = psVar389;
    while( true ) {
      psVar371 = (secp256k1_gej *)(-1L << ((byte)uVar358 & 0x3f) | (ulong)puVar381);
      modinfo = (secp256k1_modinv64_modinfo *)0x0;
      if (psVar371 != (secp256k1_gej *)0x0) {
        for (; ((ulong)psVar371 >> (long)modinfo & 1) == 0;
            modinfo = (secp256k1_modinv64_modinfo *)((long)(modinfo->modulus).v + 1)) {
        }
      }
      bVar352 = (byte)modinfo;
      psVar382 = (secp256k1_gej *)((ulong)puVar381 >> (bVar352 & 0x3f));
      psVar370 = (secp256k1_gej *)((long)psVar370 << (bVar352 & 0x3f));
      psVar348 = (secp256k1_modinv64_modinfo *)((long)psVar348 << (bVar352 & 0x3f));
      psVar387 = (secp256k1_gej *)((long)psVar387 - (long)modinfo);
      uVar358 = uVar358 - (int)modinfo;
      local_1a8._88_8_ = psVar389;
      if (uVar358 == 0) break;
      if (((ulong)psVar386 & 1) == 0) {
        psStack_1c0 = (secp256k1_gej *)0x122f38;
        secp256k1_fe_inv_var_cold_8();
LAB_00122f38:
        psStack_1c0 = (secp256k1_gej *)0x122f3d;
        secp256k1_fe_inv_var_cold_7();
LAB_00122f3d:
        psStack_1c0 = (secp256k1_gej *)0x122f42;
        secp256k1_fe_inv_var_cold_1();
LAB_00122f42:
        psStack_1c0 = (secp256k1_gej *)0x122f47;
        secp256k1_fe_inv_var_cold_2();
LAB_00122f47:
        psStack_1c0 = (secp256k1_gej *)0x122f4c;
        secp256k1_fe_inv_var_cold_6();
        psVar382 = psVar386;
        goto LAB_00122f4c;
      }
      if (((ulong)psVar382 & 1) == 0) goto LAB_00122f38;
      psVar371 = (secp256k1_gej *)
                 ((long)psVar348 * local_148._48_8_ + (long)psVar370 * local_1a8._0_8_);
      modinfo = (secp256k1_modinv64_modinfo *)(ulong)(0x3e - uVar358);
      bVar352 = (byte)(0x3e - uVar358);
      psVar366 = (secp256k1_gej *)((long)psVar386 << (bVar352 & 0x3f));
      if (psVar371 != psVar366) goto LAB_00122f3d;
      psVar366 = (secp256k1_gej *)
                 ((long)psVar373 * local_148._48_8_ + (long)psVar372 * local_1a8._0_8_);
      psVar371 = (secp256k1_gej *)((long)psVar382 << (bVar352 & 0x3f));
      if (psVar366 != psVar371) goto LAB_00122f42;
      modinfo = (secp256k1_modinv64_modinfo *)((long)psVar387[-5].x.n + 0xe);
      if (modinfo < (secp256k1_modinv64_modinfo *)0xfffffffffffffa2d) goto LAB_00122f47;
      iVar359 = (int)psVar382;
      if ((long)psVar387 < 0) {
        psVar387 = (secp256k1_gej *)-(long)psVar387;
        uVar355 = (int)psVar387 + 1;
        if ((int)uVar358 <= (int)uVar355) {
          uVar355 = uVar358;
        }
        modinfo = (secp256k1_modinv64_modinfo *)(ulong)uVar355;
        psVar371 = (secp256k1_gej *)(ulong)(uVar355 - 0x3f);
        if (0xffffffc1 < uVar355 - 0x3f) {
          psVar390 = (secp256k1_modinv64_modinfo *)-(long)psVar348;
          unaff_RBP = (secp256k1_modinv64_modinfo *)-(long)psVar370;
          psVar388 = (secp256k1_gej *)-(long)psVar386;
          psVar366 = (secp256k1_gej *)
                     ((ulong)(0x3fL << (-(char)uVar355 & 0x3fU)) >> (-(char)uVar355 & 0x3fU));
          uVar355 = (iVar359 * iVar359 + 0x3e) * iVar359 * (int)psVar388 & (uint)psVar366;
          psVar348 = psVar373;
          psVar370 = psVar372;
          psVar391 = psVar390;
          goto LAB_00122afe;
        }
        goto LAB_00122f56;
      }
      uVar355 = (int)psVar387 + 1;
      if ((int)uVar358 <= (int)uVar355) {
        uVar355 = uVar358;
      }
      modinfo = (secp256k1_modinv64_modinfo *)(ulong)uVar355;
      psVar371 = (secp256k1_gej *)(ulong)(uVar355 - 0x3f);
      if (uVar355 - 0x3f < 0xffffffc2) goto LAB_00122f51;
      psVar366 = (secp256k1_gej *)
                 ((ulong)(0xfL << (-(char)uVar355 & 0x3fU)) >> (-(char)uVar355 & 0x3fU));
      uVar355 = -(iVar359 * (((int)psVar386 * 2 + 2U & 8) + (int)psVar386)) & (uint)psVar366;
      unaff_RBP = (secp256k1_modinv64_modinfo *)psVar372;
      psVar390 = psVar373;
      psVar388 = psVar382;
      psVar382 = psVar386;
LAB_00122afe:
      uVar357 = (ulong)uVar355;
      psVar371 = (secp256k1_gej *)(uVar357 * (long)psVar382);
      puVar381 = (undefined1 *)((long)(psVar388->x).n + (long)(psVar371->x).n);
      psVar372 = (secp256k1_gej *)
                 ((long)(((secp256k1_gej *)unaff_RBP)->x).n + (long)psVar370 * uVar357);
      modinfo = (secp256k1_modinv64_modinfo *)(uVar357 * (long)psVar348);
      psVar373 = (secp256k1_modinv64_modinfo *)
                 ((long)(psVar390->modulus).v + (long)(modinfo->modulus).v);
      psVar386 = psVar382;
      if (((ulong)puVar381 & (ulong)psVar366) != 0) {
LAB_00122f4c:
        psStack_1c0 = (secp256k1_gej *)0x122f51;
        secp256k1_fe_inv_var_cold_4();
        psVar386 = psVar382;
LAB_00122f51:
        psStack_1c0 = (secp256k1_gej *)0x122f56;
        secp256k1_fe_inv_var_cold_3();
LAB_00122f56:
        psStack_1c0 = (secp256k1_gej *)0x122f5b;
        secp256k1_fe_inv_var_cold_5();
        goto LAB_00122f5b;
      }
    }
    psVar371 = (secp256k1_gej *)((long)psVar348 * (long)psVar372);
    modinfo = SUB168(SEXT816((long)psVar348) * SEXT816((long)psVar372),8);
    local_e8.u = (int64_t)psVar370;
    local_e8.v = (int64_t)psVar348;
    local_e8.q = (int64_t)psVar372;
    local_e8.r = (int64_t)psVar373;
    if ((long)psVar370 * (long)psVar373 - (long)psVar371 != 0x4000000000000000 ||
        SUB168(SEXT816((long)psVar370) * SEXT816((long)psVar373),8) - (long)modinfo !=
        (ulong)((secp256k1_gej *)((long)psVar370 * (long)psVar373) < psVar371)) {
LAB_00122f5b:
      psStack_1c0 = (secp256k1_gej *)0x122f60;
      secp256k1_fe_inv_var_cold_9();
LAB_00122f60:
      psStack_1c0 = (secp256k1_gej *)0x122f65;
      secp256k1_fe_inv_var_cold_21();
LAB_00122f65:
      psStack_1c0 = (secp256k1_gej *)0x122f6a;
      secp256k1_fe_inv_var_cold_20();
LAB_00122f6a:
      psStack_1c0 = (secp256k1_gej *)0x122f6f;
      secp256k1_fe_inv_var_cold_19();
      psVar389 = psVar391;
LAB_00122f6f:
      psStack_1c0 = (secp256k1_gej *)0x122f74;
      secp256k1_fe_inv_var_cold_18();
LAB_00122f74:
      psStack_1c0 = (secp256k1_gej *)0x122f79;
      secp256k1_fe_inv_var_cold_14();
LAB_00122f79:
      psStack_1c0 = (secp256k1_gej *)0x122f7e;
      secp256k1_fe_inv_var_cold_13();
LAB_00122f7e:
      psStack_1c0 = (secp256k1_gej *)0x122f83;
      secp256k1_fe_inv_var_cold_12();
LAB_00122f83:
      psStack_1c0 = (secp256k1_gej *)0x122f88;
      secp256k1_fe_inv_var_cold_11();
LAB_00122f88:
      psStack_1c0 = (secp256k1_gej *)0x122f8d;
      secp256k1_fe_inv_var_cold_10();
      goto LAB_00122f8d;
    }
    psStack_1c0 = (secp256k1_gej *)0x122b84;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)&local_c8,(secp256k1_modinv64_signed62 *)&local_c8.y,
               &local_e8,modinfo);
    uVar358 = local_1ac;
    psVar385 = (secp256k1_gej *)local_1a8;
    psVar366 = (secp256k1_gej *)(ulong)local_1ac;
    psVar370 = (secp256k1_gej *)(ulong)local_1ac;
    psVar391 = &secp256k1_const_modinfo_fe;
    modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1c0 = (secp256k1_gej *)0x122ba8;
    psVar371 = psVar385;
    iVar359 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar385,local_1ac,
                         &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar359 < 1) goto LAB_00122f60;
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psVar370 = (secp256k1_gej *)(ulong)uVar358;
    psStack_1c0 = (secp256k1_gej *)0x122bc2;
    psVar371 = psVar385;
    iVar359 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar385,uVar358,
                         &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar359) goto LAB_00122f65;
    psVar386 = (secp256k1_gej *)(local_148 + 0x30);
    psVar370 = (secp256k1_gej *)(ulong)uVar358;
    modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
    psStack_1c0 = (secp256k1_gej *)0x122be6;
    psVar371 = psVar386;
    iVar359 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar386,uVar358,
                         &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar359 < 1) goto LAB_00122f6a;
    modinfo = (secp256k1_modinv64_modinfo *)0x1;
    psVar370 = (secp256k1_gej *)(ulong)uVar358;
    psStack_1c0 = (secp256k1_gej *)0x122c00;
    psVar371 = psVar386;
    iVar359 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar386,uVar358,
                         &secp256k1_const_modinfo_fe.modulus,1);
    psVar389 = psVar391;
    if (-1 < iVar359) goto LAB_00122f6f;
    psStack_1c0 = (secp256k1_gej *)0x122c1d;
    secp256k1_modinv64_update_fg_62_var
              (uVar358,(secp256k1_modinv64_signed62 *)psVar385,
               (secp256k1_modinv64_signed62 *)psVar386,&local_e8);
    psVar389 = (secp256k1_modinv64_modinfo *)local_1a8._88_8_;
    if ((undefined1 *)local_148._48_8_ != (undefined1 *)0x0) {
LAB_00122c31:
      lVar376 = (long)(int)uVar358;
      uVar357 = *(ulong *)(&stack0xfffffffffffffe50 + lVar376 * 8);
      modinfo = (secp256k1_modinv64_modinfo *)auStack_110[lVar376 + -2];
      psVar371 = (secp256k1_gej *)((long)uVar357 >> 0x3f ^ uVar357 | lVar376 + -2 >> 0x3f);
      psVar370 = (secp256k1_gej *)((long)modinfo >> 0x3f ^ (ulong)modinfo | (ulong)psVar371);
      if (psVar370 == (secp256k1_gej *)0x0) {
        psVar366 = (secp256k1_gej *)(ulong)(uVar358 - 1);
        (&uStack_1b8)[lVar376] = (&uStack_1b8)[lVar376] | uVar357 << 0x3e;
        modinfo = (secp256k1_modinv64_modinfo *)((long)modinfo << 0x3e);
        auStack_110[lVar376 + -3] = auStack_110[lVar376 + -3] | (ulong)modinfo;
      }
      if (10 < (int)psVar389) goto LAB_00122f74;
      unaff_RBP = &secp256k1_const_modinfo_fe;
      modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
      psStack_1c0 = (secp256k1_gej *)0x122ca0;
      iVar365 = (int)psVar366;
      psVar370 = psVar366;
      psVar371 = psVar385;
      iVar359 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar385,iVar365,
                           &secp256k1_const_modinfo_fe.modulus,-1);
      if (iVar359 < 1) goto LAB_00122f79;
      modinfo = (secp256k1_modinv64_modinfo *)0x1;
      psStack_1c0 = (secp256k1_gej *)0x122cba;
      psVar370 = psVar366;
      psVar371 = psVar385;
      iVar359 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar385,iVar365,
                           &secp256k1_const_modinfo_fe.modulus,1);
      if (0 < iVar359) goto LAB_00122f7e;
      modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
      psStack_1c0 = (secp256k1_gej *)0x122cd6;
      psVar370 = psVar366;
      psVar371 = psVar386;
      iVar359 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar386,iVar365,
                           &secp256k1_const_modinfo_fe.modulus,-1);
      if (iVar359 < 1) goto LAB_00122f83;
      modinfo = (secp256k1_modinv64_modinfo *)0x1;
      psStack_1c0 = (secp256k1_gej *)0x122cf0;
      psVar370 = psVar366;
      psVar371 = psVar386;
      iVar359 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar386,iVar365,
                           &secp256k1_const_modinfo_fe.modulus,1);
      if (iVar359 < 0) {
        bVar353 = true;
        psVar389 = (secp256k1_modinv64_modinfo *)(ulong)((int)psVar389 + 1);
        goto LAB_00122d28;
      }
      goto LAB_00122f88;
    }
    if (1 < (int)uVar358) {
      uVar357 = 1;
      uVar360 = 0;
      do {
        uVar360 = uVar360 | auStack_110[uVar357 - 1];
        uVar357 = uVar357 + 1;
      } while (uVar358 != uVar357);
      if (uVar360 != 0) goto LAB_00122c31;
    }
    bVar353 = false;
LAB_00122d28:
  } while (bVar353);
  psVar371 = (secp256k1_gej *)(local_148 + 0x30);
  iVar365 = (int)psVar366;
  modinfo = (secp256k1_modinv64_modinfo *)0x0;
  psStack_1c0 = (secp256k1_gej *)0x122d48;
  psVar370 = psVar366;
  iVar359 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar371,iVar365,&SECP256K1_SIGNED62_ONE,0);
  if (iVar359 == 0) {
    psStack_1c0 = (secp256k1_gej *)0x122d6a;
    iVar359 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)local_1a8,iVar365,&SECP256K1_SIGNED62_ONE,-1
                        );
    psVar348 = extraout_RDX;
    if (iVar359 == 0) {
LAB_00122e13:
      psStack_1c0 = (secp256k1_gej *)0x122e2b;
      secp256k1_modinv64_normalize_62
                ((secp256k1_modinv64_signed62 *)&local_c8,
                 *(int64_t *)(&stack0xfffffffffffffe50 + (long)iVar365 * 8),psVar348);
      psVar366 = (secp256k1_gej *)local_1a8._80_8_;
      local_148._32_8_ = local_c8.x.n[4];
      local_148._16_8_ = local_c8.x.n[2];
      local_148._24_8_ = local_c8.x.n[3];
      local_148._0_8_ = local_c8.x.n[0];
      local_148._8_8_ = local_c8.x.n[1];
      psStack_1c0 = (secp256k1_gej *)0x122e53;
      secp256k1_fe_from_signed62
                ((secp256k1_fe *)local_1a8._80_8_,(secp256k1_modinv64_signed62 *)local_148);
      (psVar366->x).magnitude = (uint)(0 < *(int *)(local_1a8._48_8_ + 0x28));
      (psVar366->x).normalized = 1;
      psStack_1c0 = (secp256k1_gej *)0x122e73;
      secp256k1_fe_verify(&psVar366->x);
      uVar357 = (psVar366->x).n[4];
      uVar361 = (uVar357 >> 0x30) * local_1a8._56_8_ + (psVar366->x).n[0];
      uVar360 = (uVar361 >> 0x34) + (psVar366->x).n[1];
      uVar362 = (uVar360 >> 0x34) + (psVar366->x).n[2];
      uVar369 = (uVar362 >> 0x34) + (psVar366->x).n[3];
      psVar370 = (secp256k1_gej *)((uVar369 >> 0x34) + (uVar357 & 0xffffffffffff));
      psVar371 = (secp256k1_gej *)
                 ((uVar361 ^ 0x1000003d0) & uVar360 & uVar362 & uVar369 &
                 ((ulong)psVar370 ^ 0xf000000000000));
      bVar353 = psVar371 == (secp256k1_gej *)0xfffffffffffff ||
                ((uVar360 | uVar361 | uVar362 | uVar369) & 0xfffffffffffff) == 0 &&
                psVar370 == (secp256k1_gej *)0x0;
      modinfo = (secp256k1_modinv64_modinfo *)
                CONCAT71((int7)(((ulong)psVar370 ^ 0xf000000000000) >> 8),bVar353);
      if ((local_1a8._64_8_ != 0xfffffffffffff && local_1a8._72_8_ != 0) != bVar353) {
        secp256k1_fe_verify(&psVar366->x);
        return;
      }
      goto LAB_00122f92;
    }
    psStack_1c0 = (secp256k1_gej *)0x122d8a;
    iVar359 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)local_1a8,iVar365,&SECP256K1_SIGNED62_ONE,1)
    ;
    psVar348 = extraout_RDX_00;
    if (iVar359 == 0) goto LAB_00122e13;
    psVar371 = (secp256k1_gej *)local_148;
    psVar370 = (secp256k1_gej *)0x5;
    modinfo = (secp256k1_modinv64_modinfo *)0x0;
    psStack_1c0 = (secp256k1_gej *)0x122daa;
    iVar359 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)psVar371,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar359 == 0) {
      psVar371 = &local_c8;
      psVar370 = (secp256k1_gej *)0x5;
      modinfo = (secp256k1_modinv64_modinfo *)0x0;
      psStack_1c0 = (secp256k1_gej *)0x122dcd;
      iVar359 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar371,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar359 == 0) {
        psStack_1c0 = (secp256k1_gej *)0x122ded;
        iVar359 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)local_1a8,iVar365,
                             &secp256k1_const_modinfo_fe.modulus,1);
        psVar348 = extraout_RDX_01;
        if (iVar359 != 0) {
          psVar371 = (secp256k1_gej *)local_1a8;
          modinfo = (secp256k1_modinv64_modinfo *)0xffffffffffffffff;
          psStack_1c0 = (secp256k1_gej *)0x122e0b;
          psVar370 = psVar366;
          iVar359 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar371,iVar365,
                               &secp256k1_const_modinfo_fe.modulus,-1);
          psVar348 = extraout_RDX_02;
          if (iVar359 != 0) goto LAB_00122f97;
        }
        goto LAB_00122e13;
      }
    }
  }
  else {
LAB_00122f8d:
    psStack_1c0 = (secp256k1_gej *)0x122f92;
    secp256k1_fe_inv_var_cold_15();
LAB_00122f92:
    psStack_1c0 = (secp256k1_gej *)0x122f97;
    secp256k1_fe_inv_var_cold_17();
  }
LAB_00122f97:
  psStack_1c0 = (secp256k1_gej *)secp256k1_modinv64_update_fg_62_var;
  secp256k1_fe_inv_var_cold_16();
  iVar359 = (int)psVar371;
  psStack_1e8 = psVar366;
  psStack_1e0 = psVar385;
  psStack_1d8 = psVar386;
  psStack_1d0 = psVar387;
  psStack_1c8 = psVar389;
  psStack_1c0 = (secp256k1_gej *)unaff_RBP;
  if (iVar359 < 1) {
LAB_00123256:
    auStack_2a0._120_8_ = 0x12325b;
    secp256k1_modinv64_update_fg_62_var_cold_9();
    psVar372 = psVar386;
LAB_0012325b:
    auStack_2a0._120_8_ = 0x123260;
    secp256k1_modinv64_update_fg_62_var_cold_1();
LAB_00123260:
    auStack_2a0._120_8_ = 0x123265;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_00123265:
    auStack_2a0._120_8_ = 0x12326a;
    secp256k1_modinv64_update_fg_62_var_cold_3();
    psVar382 = (secp256k1_gej *)unaff_RBP;
    psVar386 = psVar372;
LAB_0012326a:
    auStack_2a0._120_8_ = 0x12326f;
    secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0012326f:
    auStack_2a0._120_8_ = 0x123274;
    secp256k1_modinv64_update_fg_62_var_cold_8();
  }
  else {
    psVar389 = (secp256k1_modinv64_modinfo *)0x7fffffffffffffff;
    lStack_1f0 = (modinfo->modulus).v[0];
    lStack_1f8 = (modinfo->modulus).v[1];
    uVar1 = (psVar370->x).n[0];
    uVar2 = (extraout_RDX_03->x).n[0];
    psVar387 = (secp256k1_gej *)(uVar1 * lStack_1f0);
    psVar366 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_1f0),8);
    uVar357 = uVar2 * lStack_1f8;
    lVar363 = SUB168(SEXT816((long)uVar2) * SEXT816(lStack_1f8),8);
    lVar376 = (0x7fffffffffffffff - lVar363) - (long)psVar366;
    psVar385 = extraout_RDX_03;
    psVar372 = psVar386;
    if (-1 < lVar363 &&
        (SBORROW8(0x7fffffffffffffff - lVar363,(long)psVar366) !=
        SBORROW8(lVar376,(ulong)((secp256k1_gej *)~uVar357 < psVar387))) !=
        (long)(lVar376 - (ulong)((secp256k1_gej *)~uVar357 < psVar387)) < 0) goto LAB_0012325b;
    lStack_200 = (modinfo->modulus).v[2];
    puVar378 = (uint64_t *)((long)(psVar387->x).n + uVar357);
    lVar374 = (long)(psVar366->x).n + (ulong)CARRY8(uVar357,(ulong)psVar387) + lVar363;
    psVar372 = (secp256k1_gej *)(modinfo->modulus).v[3];
    psVar366 = (secp256k1_gej *)(uVar1 * lStack_200);
    lVar363 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_200),8);
    uVar357 = uVar2 * (long)psVar372;
    lVar364 = SUB168(SEXT816((long)uVar2) * SEXT816((long)psVar372),8);
    psVar387 = (secp256k1_gej *)(-1 - uVar357);
    lVar376 = (0x7fffffffffffffff - lVar364) - lVar363;
    psStack_208 = psVar372;
    if (-1 < lVar364 &&
        (SBORROW8(0x7fffffffffffffff - lVar364,lVar363) !=
        SBORROW8(lVar376,(ulong)(psVar387 < psVar366))) !=
        (long)(lVar376 - (ulong)(psVar387 < psVar366)) < 0) goto LAB_00123260;
    puVar375 = (uint64_t *)((long)(psVar366->x).n + uVar357);
    lVar376 = lVar364 + lVar363 + (ulong)CARRY8(uVar357,(ulong)psVar366);
    if (((ulong)puVar378 & 0x3fffffffffffffff) != 0) goto LAB_00123265;
    psVar382 = (secp256k1_gej *)unaff_RBP;
    psVar386 = psVar372;
    if (((ulong)puVar375 & 0x3fffffffffffffff) != 0) goto LAB_0012326a;
    uVar357 = (ulong)puVar375 >> 0x3e | lVar376 * 4;
    uVar360 = (ulong)puVar378 >> 0x3e | lVar374 * 4;
    lVar376 = lVar376 >> 0x3e;
    lVar374 = lVar374 >> 0x3e;
    auStack_2a0._132_4_ = iVar359;
    if (iVar359 != 1) {
      auStack_2a0._136_8_ = (ulong)psVar371 & 0xffffffff;
      psVar371 = (secp256k1_gej *)0x1;
      do {
        uVar1 = (psVar370->x).n[(long)psVar371];
        psVar387 = (secp256k1_gej *)(uVar1 * lStack_1f0 + uVar360);
        psVar366 = (secp256k1_gej *)
                   (SUB168(SEXT816((long)uVar1) * SEXT816(lStack_1f0),8) + lVar374 +
                   (ulong)CARRY8(uVar1 * lStack_1f0,uVar360));
        psVar386 = (secp256k1_gej *)(extraout_RDX_03->x).n[(long)psVar371];
        psVar389 = (secp256k1_modinv64_modinfo *)((long)psVar386 * lStack_1f8);
        lVar374 = SUB168(SEXT816((long)psVar386) * SEXT816(lStack_1f8),8);
        psVar385 = (secp256k1_gej *)0x7fffffffffffffff;
        uVar360 = (ulong)((secp256k1_gej *)(-1 - (long)psVar389) < psVar387);
        lVar363 = (0x7fffffffffffffff - lVar374) - (long)psVar366;
        psVar382 = (secp256k1_gej *)0x8000000000000000;
        lVar383 = (-0x8000000000000000 - lVar374) -
                  (ulong)(psVar389 != (secp256k1_modinv64_modinfo *)0x0);
        lVar364 = (long)psVar366 - lVar383;
        bVar353 = (SBORROW8(0x7fffffffffffffff - lVar374,(long)psVar366) !=
                  SBORROW8(lVar363,uVar360)) == (long)(lVar363 - uVar360) < 0;
        if (lVar374 < 0) {
          bVar353 = (SBORROW8((long)psVar366,lVar383) !=
                    SBORROW8(lVar364,(ulong)(psVar387 < (secp256k1_gej *)-(long)psVar389))) ==
                    (long)(lVar364 - (ulong)(psVar387 < (secp256k1_gej *)-(long)psVar389)) < 0;
        }
        psStack_210 = psVar370;
        if (!bVar353) {
          auStack_2a0._120_8_ = 0x123251;
          secp256k1_modinv64_update_fg_62_var_cold_5();
LAB_00123251:
          psVar370 = psVar382;
          auStack_2a0._120_8_ = 0x123256;
          secp256k1_modinv64_update_fg_62_var_cold_6();
          unaff_RBP = (secp256k1_modinv64_modinfo *)extraout_RDX_03;
          goto LAB_00123256;
        }
        uVar362 = uVar1 * lStack_200 + uVar357;
        lVar364 = SUB168(SEXT816((long)uVar1) * SEXT816(lStack_200),8) + lVar376 +
                  (ulong)CARRY8(uVar1 * lStack_200,uVar357);
        uVar361 = (long)psVar386 * (long)psVar372;
        lVar363 = SUB168(SEXT816((long)psVar386) * SEXT816((long)psVar372),8);
        uVar357 = (ulong)(-uVar361 - 1 < uVar362);
        lVar376 = (0x7fffffffffffffff - lVar363) - lVar364;
        psVar385 = (secp256k1_gej *)(lVar376 - uVar357);
        psVar386 = (secp256k1_gej *)((-0x8000000000000000 - lVar363) - (ulong)(uVar361 != 0));
        bVar353 = (SBORROW8(0x7fffffffffffffff - lVar363,lVar364) != SBORROW8(lVar376,uVar357)) ==
                  (long)psVar385 < 0;
        if (lVar363 < 0) {
          bVar353 = (SBORROW8(lVar364,(long)psVar386) !=
                    SBORROW8(lVar364 - (long)psVar386,(ulong)(uVar362 < -uVar361))) ==
                    (long)((lVar364 - (long)psVar386) - (ulong)(uVar362 < -uVar361)) < 0;
        }
        if (!bVar353) goto LAB_00123251;
        puVar381 = (undefined1 *)((long)(psVar389->modulus).v + (long)(psVar387->x).n);
        lVar374 = (long)(psVar366->x).n + (ulong)CARRY8((ulong)psVar389,(ulong)psVar387) + lVar374;
        lVar376 = lVar363 + lVar364 + (ulong)CARRY8(uVar361,uVar362);
        uVar360 = lVar374 * 4 | (ulong)puVar381 >> 0x3e;
        psVar389 = (secp256k1_modinv64_modinfo *)((ulong)puVar381 & 0x3fffffffffffffff);
        (psVar370->x).n[(long)&psVar371[-1].field_0x97] = (uint64_t)psVar389;
        uVar357 = lVar376 * 4 | uVar361 + uVar362 >> 0x3e;
        (extraout_RDX_03->x).n[(long)&psVar371[-1].field_0x97] =
             uVar361 + uVar362 & 0x3fffffffffffffff;
        psVar371 = (secp256k1_gej *)((long)(psVar371->x).n + 1);
        lVar376 = lVar376 >> 0x3e;
        lVar374 = lVar374 >> 0x3e;
        psVar382 = extraout_RDX_03;
      } while ((secp256k1_gej *)auStack_2a0._136_8_ != psVar371);
    }
    psVar385 = extraout_RDX_03;
    if (lVar374 + -1 + (ulong)(0x7fffffffffffffff < uVar360) != -1) goto LAB_0012326f;
    (psVar370->x).n[(long)iVar359 + -1] = uVar360;
    if (lVar376 + -1 + (ulong)(0x7fffffffffffffff < uVar357) == -1) {
      (extraout_RDX_03->x).n[(long)iVar359 + -1] = uVar357;
      return;
    }
  }
  auStack_2a0._120_8_ = secp256k1_ellswift_prng;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  psVar348 = (secp256k1_modinv64_modinfo *)auStack_2a0;
  psVar372 = (secp256k1_gej *)psVar348;
  auStack_2a0._104_8_ = psVar366;
  auStack_2a0._112_8_ = psVar387;
  auStack_2a0._120_8_ = psVar389;
  for (lVar376 = 0xd; lVar376 != 0; lVar376 = lVar376 + -1) {
    (psVar372->x).n[0] = (psVar370->x).n[0];
    psVar370 = (secp256k1_gej *)((long)psVar370 + (ulong)bVar354 * -0x10 + 8);
    psVar372 = (secp256k1_gej *)((long)psVar372 + (ulong)bVar354 * -0x10 + 8);
  }
  uVar357 = (ulong)auStack_2a0._96_8_ >> 6;
  psStack_2b0 = (secp256k1_gej *)0x1232b1;
  secp256k1_sha256_write((secp256k1_sha256 *)psVar348,auStack_2a4,4);
  psStack_2b0 = (secp256k1_gej *)0x1232bc;
  psVar387 = psVar371;
  psVar370 = (secp256k1_gej *)psVar348;
  secp256k1_sha256_finalize((secp256k1_sha256 *)psVar348,(uchar *)psVar371);
  psVar366 = (secp256k1_gej *)(uVar357 + 1);
  if ((secp256k1_gej *)((ulong)auStack_2a0._96_8_ >> 6) == psVar366) {
    return;
  }
  psStack_2b0 = (secp256k1_gej *)secp256k1_ge_x_on_curve_var;
  secp256k1_ellswift_prng_cold_1();
  psStack_338 = (secp256k1_gej *)0x1232f1;
  psVar372 = psVar370;
  psStack_2d8 = psVar371;
  psStack_2d0 = psVar385;
  psStack_2c8 = psVar386;
  psStack_2c0 = (secp256k1_gej *)psVar348;
  psStack_2b8 = psVar366;
  psStack_2b0 = psVar382;
  secp256k1_fe_verify(&psVar370->x);
  if ((psVar370->x).magnitude < 9) {
    uVar357 = (psVar370->x).n[0];
    uVar360 = (psVar370->x).n[1];
    uVar361 = (psVar370->x).n[2];
    uVar362 = (psVar370->x).n[3];
    uVar369 = (psVar370->x).n[4];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar357 * 2;
    auVar163._8_8_ = 0;
    auVar163._0_8_ = uVar362;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar360 * 2;
    auVar164._8_8_ = 0;
    auVar164._0_8_ = uVar361;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar369;
    auVar165._8_8_ = 0;
    auVar165._0_8_ = uVar369;
    uVar349 = SUB168(auVar5 * auVar165,0);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar349 & 0xfffffffffffff;
    auVar3 = auVar4 * auVar164 + auVar3 * auVar163 + auVar6 * ZEXT816(0x1000003d10);
    uVar367 = auVar3._0_8_;
    uStack_310 = uVar367 & 0xfffffffffffff;
    auVar291._8_8_ = 0;
    auVar291._0_8_ = uVar367 >> 0x34 | auVar3._8_8_ << 0xc;
    uVar369 = uVar369 * 2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar357;
    auVar166._8_8_ = 0;
    auVar166._0_8_ = uVar369;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar360 * 2;
    auVar167._8_8_ = 0;
    auVar167._0_8_ = uVar362;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar361;
    auVar168._8_8_ = 0;
    auVar168._0_8_ = uVar361;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar349 >> 0x34 | SUB168(auVar5 * auVar165,8) << 0xc;
    auVar3 = auVar7 * auVar166 + auVar291 + auVar8 * auVar167 + auVar9 * auVar168 +
             auVar10 * ZEXT816(0x1000003d10);
    uStack_318 = auVar3._0_8_;
    auVar292._8_8_ = 0;
    auVar292._0_8_ = uStack_318 >> 0x34 | auVar3._8_8_ << 0xc;
    uStack_320 = (uStack_318 & 0xfffffffffffff) >> 0x30;
    uStack_318 = uStack_318 & 0xffffffffffff;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar357;
    auVar169._8_8_ = 0;
    auVar169._0_8_ = uVar357;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar360;
    auVar170._8_8_ = 0;
    auVar170._0_8_ = uVar369;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar361 * 2;
    auVar171._8_8_ = 0;
    auVar171._0_8_ = uVar362;
    auVar3 = auVar12 * auVar170 + auVar292 + auVar13 * auVar171;
    uVar349 = auVar3._0_8_;
    auVar294._8_8_ = 0;
    auVar294._0_8_ = uVar349 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar172._8_8_ = 0;
    auVar172._0_8_ = (uVar349 & 0xfffffffffffff) << 4 | uStack_320;
    auVar3 = auVar11 * auVar169 + ZEXT816(0x1000003d1) * auVar172;
    uVar349 = auVar3._0_8_;
    sStack_308.n[0] = uVar349 & 0xfffffffffffff;
    auVar293._8_8_ = 0;
    auVar293._0_8_ = uVar349 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar357 * 2;
    auVar173._8_8_ = 0;
    auVar173._0_8_ = uVar360;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar361;
    auVar174._8_8_ = 0;
    auVar174._0_8_ = uVar369;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar362;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar362;
    auVar4 = auVar15 * auVar174 + auVar294 + auVar16 * auVar175;
    uVar349 = auVar4._0_8_;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar349 & 0xfffffffffffff;
    auVar3 = auVar14 * auVar173 + auVar293 + auVar17 * ZEXT816(0x1000003d10);
    uVar367 = auVar3._0_8_;
    auVar296._8_8_ = 0;
    auVar296._0_8_ = uVar349 >> 0x34 | auVar4._8_8_ << 0xc;
    sStack_308.n[1] = uVar367 & 0xfffffffffffff;
    auVar295._8_8_ = 0;
    auVar295._0_8_ = uVar367 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar357 * 2;
    auVar176._8_8_ = 0;
    auVar176._0_8_ = uVar361;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar360;
    auVar177._8_8_ = 0;
    auVar177._0_8_ = uVar360;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar362;
    auVar178._8_8_ = 0;
    auVar178._0_8_ = uVar369;
    auVar296 = auVar20 * auVar178 + auVar296;
    uVar357 = auVar296._0_8_;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar357 & 0xfffffffffffff;
    auVar3 = auVar18 * auVar176 + auVar295 + auVar19 * auVar177 + auVar21 * ZEXT816(0x1000003d10);
    uVar360 = auVar3._0_8_;
    sStack_308.n[2] = uVar360 & 0xfffffffffffff;
    auVar297._8_8_ = 0;
    auVar297._0_8_ = (uVar360 >> 0x34 | auVar3._8_8_ << 0xc) + uStack_310;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar357 >> 0x34 | auVar296._8_8_ << 0xc;
    auVar297 = auVar22 * ZEXT816(0x1000003d10) + auVar297;
    uVar357 = auVar297._0_8_;
    sStack_308.n[3] = uVar357 & 0xfffffffffffff;
    sStack_308.n[4] = (uVar357 >> 0x34 | auVar297._8_8_ << 0xc) + uStack_318;
    sStack_308.magnitude = 1;
    sStack_308.normalized = 0;
    psStack_338 = (secp256k1_gej *)0x12353d;
    psStack_328 = psVar370;
    secp256k1_fe_verify(&sStack_308);
    psStack_338 = (secp256k1_gej *)0x12354d;
    secp256k1_fe_mul(&sStack_308,&sStack_308,&psStack_328->x);
    psStack_338 = (secp256k1_gej *)0x123555;
    secp256k1_fe_verify(&sStack_308);
    sStack_308.n[0] = sStack_308.n[0] + 2;
    sStack_308.normalized = 0;
    sStack_308.magnitude = sStack_308.magnitude + 1;
    psStack_338 = (secp256k1_gej *)0x12356c;
    secp256k1_fe_verify(&sStack_308);
    psStack_338 = (secp256k1_gej *)0x123574;
    secp256k1_fe_is_square_var(&sStack_308);
    return;
  }
  psStack_338 = (secp256k1_gej *)secp256k1_fe_is_square_var;
  secp256k1_ge_x_on_curve_var_cold_1();
  auStack_398._0_8_ = (psVar372->x).n[0];
  auStack_398._8_8_ = (psVar372->x).n[1];
  auStack_398._16_8_ = (psVar372->x).n[2];
  auStack_398._24_8_ = (psVar372->x).n[3];
  auStack_398._32_8_ = (psVar372->x).n[4];
  auStack_398._40_4_ = (psVar372->x).magnitude;
  auStack_398._44_4_ = (psVar372->x).normalized;
  psStack_460 = (secp256k1_gej *)0x1235c4;
  auStack_398._56_8_ = psVar370;
  auStack_398._64_8_ = psVar385;
  auStack_398._72_8_ = psVar386;
  auStack_398._80_8_ = psVar348;
  auStack_398._88_8_ = psVar366;
  psStack_338 = psVar382;
  secp256k1_fe_verify(&psVar372->x);
  auStack_3e8._0_8_ = (psVar372->x).n[0];
  auStack_3e8._8_8_ = (psVar372->x).n[1];
  auStack_3e8._16_8_ = (psVar372->x).n[2];
  auStack_3e8._24_8_ = (psVar372->x).n[3];
  auStack_3e8._32_8_ = (psVar372->x).n[4];
  auStack_3e8._40_4_ = (psVar372->x).magnitude;
  auStack_3e8._44_4_ = (psVar372->x).normalized;
  psVar370 = (secp256k1_gej *)auStack_3e8;
  psStack_460 = (secp256k1_gej *)0x1235e7;
  secp256k1_fe_normalize_var((secp256k1_fe *)psVar370);
  psStack_460 = (secp256k1_gej *)0x1235ef;
  psVar372 = psVar370;
  secp256k1_fe_verify((secp256k1_fe *)psVar370);
  if (auStack_3e8._44_4_ == 0) {
LAB_00123b9b:
    psStack_460 = (secp256k1_gej *)0x123ba0;
    secp256k1_fe_is_square_var_cold_19();
    psVar371 = psVar370;
    psVar388 = (secp256k1_gej *)psVar348;
LAB_00123ba0:
    psStack_460 = (secp256k1_gej *)0x123ba5;
    secp256k1_fe_is_square_var_cold_17();
  }
  else {
    if (((auStack_3e8._16_8_ == 0 && auStack_3e8._24_8_ == 0) &&
        (auStack_3e8._8_8_ == 0 && auStack_3e8._0_8_ == 0)) && auStack_3e8._32_8_ == 0) {
      psVar371 = (secp256k1_gej *)0x1;
    }
    else {
      auStack_440._0_8_ = (auStack_3e8._8_8_ << 0x34 | auStack_3e8._0_8_) & 0x3fffffffffffffff;
      auStack_440._8_8_ =
           (ulong)((uint)auStack_3e8._16_8_ & 0xfffff) << 0x2a | (ulong)auStack_3e8._8_8_ >> 10;
      auStack_440._16_8_ =
           (ulong)((uint)auStack_3e8._24_8_ & 0x3fffffff) << 0x20 |
           (ulong)auStack_3e8._16_8_ >> 0x14;
      psVar372 = (secp256k1_gej *)
                 ((auStack_3e8._32_8_ & 0xffffffffff) << 0x16 | (ulong)auStack_3e8._24_8_ >> 0x1e);
      auStack_440._32_8_ = (ulong)auStack_3e8._32_8_ >> 0x28;
      auStack_410[1] = 0;
      auStack_410[2] = 0;
      auStack_440._40_8_ = -0x1000003d1;
      auStack_410[0] = 0;
      auStack_410[3] = 0x100;
      psVar387 = (secp256k1_gej *)(auStack_440._8_8_ | auStack_440._0_8_);
      psVar371 = psVar370;
      psVar388 = (secp256k1_gej *)psVar348;
      auStack_440._24_8_ = psVar372;
      if (((auStack_440._32_8_ == 0 && auStack_440._16_8_ == 0) && psVar387 == (secp256k1_gej *)0x0)
          && psVar372 == (secp256k1_gej *)0x0) goto LAB_00123ba0;
      psVar370 = (secp256k1_gej *)0x5;
      psVar382 = (secp256k1_gej *)0xffffffffffffffff;
      uVar357 = 0;
      psVar371 = (secp256k1_gej *)0x0;
      do {
        psVar372 = (secp256k1_gej *)(auStack_410[0] << 0x3e | auStack_440._40_8_);
        puVar375 = (uint64_t *)(auStack_440._8_8_ << 0x3e | auStack_440._0_8_);
        psVar350 = (secp256k1_gej *)0x0;
        psVar377 = (secp256k1_gej *)0x0;
        psVar386 = (secp256k1_gej *)0x1;
        iVar359 = 0x3e;
        psVar388 = (secp256k1_gej *)0x1;
        puVar378 = puVar375;
        psVar384 = psVar372;
        while( true ) {
          uVar360 = -1L << ((byte)iVar359 & 0x3f) | (ulong)puVar378;
          lVar376 = 0;
          if (uVar360 != 0) {
            for (; (uVar360 >> lVar376 & 1) == 0; lVar376 = lVar376 + 1) {
            }
          }
          bVar354 = (byte)lVar376;
          psVar379 = (secp256k1_gej *)((ulong)puVar378 >> (bVar354 & 0x3f));
          psVar388 = (secp256k1_gej *)((long)psVar388 << (bVar354 & 0x3f));
          psVar350 = (secp256k1_gej *)((long)psVar350 << (bVar354 & 0x3f));
          psVar382 = (secp256k1_gej *)((long)psVar382 - lVar376);
          psVar387 = (secp256k1_gej *)((ulong)psVar384 >> 2);
          uVar358 = ((uint)((ulong)psVar384 >> 1) ^ (uint)psVar387) & (uint)lVar376 ^ (uint)psVar371
          ;
          psVar385 = (secp256k1_gej *)(ulong)uVar358;
          iVar359 = iVar359 - (uint)lVar376;
          uStack_450 = uVar357;
          psStack_448 = psVar370;
          if (iVar359 == 0) break;
          if (((ulong)psVar384 & 1) == 0) {
            psStack_460 = (secp256k1_gej *)0x123b55;
            secp256k1_fe_is_square_var_cold_7();
LAB_00123b55:
            psStack_460 = (secp256k1_gej *)0x123b5a;
            secp256k1_fe_is_square_var_cold_6();
LAB_00123b5a:
            psStack_460 = (secp256k1_gej *)0x123b5f;
            secp256k1_fe_is_square_var_cold_1();
LAB_00123b5f:
            psStack_460 = (secp256k1_gej *)0x123b64;
            secp256k1_fe_is_square_var_cold_2();
            goto LAB_00123b64;
          }
          if (((ulong)psVar379 & 1) == 0) goto LAB_00123b55;
          psVar387 = (secp256k1_gej *)
                     ((long)psVar350 * (long)puVar375 + (long)psVar388 * (long)psVar372);
          bVar354 = 0x3e - (char)iVar359;
          psVar371 = (secp256k1_gej *)((long)psVar384 << (bVar354 & 0x3f));
          if (psVar387 != psVar371) goto LAB_00123b5a;
          psVar371 = (secp256k1_gej *)
                     ((long)psVar386 * (long)puVar375 + (long)psVar377 * (long)psVar372);
          psVar387 = (secp256k1_gej *)((long)psVar379 << (bVar354 & 0x3f));
          if (psVar371 != psVar387) goto LAB_00123b5f;
          iVar380 = (int)psVar384;
          iVar365 = (int)psVar379;
          if ((long)psVar382 < 0) {
            psVar382 = (secp256k1_gej *)-(long)psVar382;
            iVar356 = (int)psVar382 + 1;
            if (iVar359 <= iVar356) {
              iVar356 = iVar359;
            }
            psVar387 = (secp256k1_gej *)(ulong)(iVar356 - 0x3fU);
            if (0xffffffc1 < iVar356 - 0x3fU) {
              psVar371 = (secp256k1_gej *)
                         (ulong)(uVar358 ^ (uint)(((ulong)psVar379 & (ulong)psVar384) >> 1));
              psVar366 = (secp256k1_gej *)
                         ((ulong)(0x3fL << (-(char)iVar356 & 0x3fU)) >> (-(char)iVar356 & 0x3fU));
              uVar358 = (iVar365 * iVar365 + 0x3e) * iVar365 * iVar380 & (uint)psVar366;
              psVar351 = psVar350;
              psVar350 = psVar386;
              psVar368 = psVar379;
              psVar387 = psVar388;
              psVar388 = psVar377;
              goto LAB_00123874;
            }
            goto LAB_00123b6e;
          }
          iVar356 = (int)psVar382 + 1;
          if (iVar359 <= iVar356) {
            iVar356 = iVar359;
          }
          psVar387 = (secp256k1_gej *)(ulong)(iVar356 - 0x3fU);
          if (iVar356 - 0x3fU < 0xffffffc2) goto LAB_00123b69;
          psVar366 = (secp256k1_gej *)
                     ((ulong)(0xfL << (-(char)iVar356 & 0x3fU)) >> (-(char)iVar356 & 0x3fU));
          uVar358 = -(iVar365 * ((iVar380 * 2 + 2U & 8) + iVar380)) & (uint)psVar366;
          psVar351 = psVar386;
          psVar368 = psVar384;
          psVar387 = psVar377;
          psVar384 = psVar379;
          psVar371 = psVar385;
LAB_00123874:
          uVar360 = (ulong)uVar358;
          puVar378 = (uint64_t *)((long)(psVar384->x).n + uVar360 * (long)psVar368);
          psVar377 = (secp256k1_gej *)((long)(psVar387->x).n + (long)psVar388 * uVar360);
          psVar386 = (secp256k1_gej *)((long)(psVar351->x).n + uVar360 * (long)psVar350);
          psVar384 = psVar368;
          psVar385 = psVar371;
          if (((ulong)puVar378 & (ulong)psVar366) != 0) {
LAB_00123b64:
            psStack_460 = (secp256k1_gej *)0x123b69;
            secp256k1_fe_is_square_var_cold_4();
LAB_00123b69:
            psStack_460 = (secp256k1_gej *)0x123b6e;
            secp256k1_fe_is_square_var_cold_3();
LAB_00123b6e:
            psStack_460 = (secp256k1_gej *)0x123b73;
            secp256k1_fe_is_square_var_cold_5();
            psVar370 = psVar371;
            psVar348 = (secp256k1_modinv64_modinfo *)psVar388;
            goto LAB_00123b73;
          }
        }
        psVar372 = SUB168(SEXT816((long)psVar350) * SEXT816((long)psVar377),8);
        uVar357 = (long)psVar388 * (long)psVar386 - (long)psVar350 * (long)psVar377;
        uVar360 = (SUB168(SEXT816((long)psVar388) * SEXT816((long)psVar386),8) - (long)psVar372) -
                  (ulong)((ulong)((long)psVar388 * (long)psVar386) <
                         (ulong)((long)psVar350 * (long)psVar377));
        psVar387 = (secp256k1_gej *)(~uVar360 | uVar357 ^ 0xc000000000000000);
        auStack_3e8._48_8_ = psVar388;
        psStack_3b0 = psVar350;
        psStack_3a8 = psVar377;
        psStack_3a0 = psVar386;
        if ((psVar387 != (secp256k1_gej *)0x0) && (uVar357 != 0x4000000000000000 || uVar360 != 0))
        goto LAB_00123baa;
        psVar366 = (secp256k1_gej *)(auStack_440 + 0x28);
        iVar365 = (int)psVar370;
        psVar348 = &secp256k1_const_modinfo_fe;
        psStack_460 = (secp256k1_gej *)0x123921;
        psVar387 = psVar370;
        psVar372 = psVar366;
        iVar359 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar366,iVar365,
                             &secp256k1_const_modinfo_fe.modulus,0);
        psVar386 = (secp256k1_gej *)auStack_440;
        if (iVar359 < 1) {
LAB_00123b73:
          psStack_460 = (secp256k1_gej *)0x123b78;
          secp256k1_fe_is_square_var_cold_15();
LAB_00123b78:
          psStack_460 = (secp256k1_gej *)0x123b7d;
          secp256k1_fe_is_square_var_cold_14();
LAB_00123b7d:
          psStack_460 = (secp256k1_gej *)0x123b82;
          secp256k1_fe_is_square_var_cold_13();
LAB_00123b82:
          psStack_460 = (secp256k1_gej *)0x123b87;
          secp256k1_fe_is_square_var_cold_12();
LAB_00123b87:
          psStack_460 = (secp256k1_gej *)0x123b8c;
          secp256k1_fe_is_square_var_cold_11();
LAB_00123b8c:
          psStack_460 = (secp256k1_gej *)0x123b91;
          secp256k1_fe_is_square_var_cold_10();
LAB_00123b91:
          psStack_460 = (secp256k1_gej *)0x123b96;
          secp256k1_fe_is_square_var_cold_9();
LAB_00123b96:
          psStack_460 = (secp256k1_gej *)0x123b9b;
          secp256k1_fe_is_square_var_cold_8();
          goto LAB_00123b9b;
        }
        psStack_460 = (secp256k1_gej *)0x123940;
        psVar387 = psVar370;
        psVar372 = psVar366;
        iVar359 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar366,iVar365,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (0 < iVar359) goto LAB_00123b78;
        psStack_460 = (secp256k1_gej *)0x123957;
        psVar387 = psVar370;
        psVar372 = psVar386;
        iVar359 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar386,iVar365,
                             &secp256k1_const_modinfo_fe.modulus,0);
        if (iVar359 < 1) goto LAB_00123b7d;
        psStack_460 = (secp256k1_gej *)0x123971;
        psVar387 = psVar370;
        psVar372 = psVar386;
        iVar359 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar386,iVar365,
                             &secp256k1_const_modinfo_fe.modulus,1);
        if (-1 < iVar359) goto LAB_00123b82;
        psStack_460 = (secp256k1_gej *)0x12398e;
        secp256k1_modinv64_update_fg_62_var
                  (iVar365,(secp256k1_modinv64_signed62 *)psVar366,
                   (secp256k1_modinv64_signed62 *)psVar386,
                   (secp256k1_modinv64_trans2x2 *)(auStack_3e8 + 0x30));
        if (auStack_440._40_8_ != 1) {
LAB_001239be:
          lVar376 = (long)iVar365;
          if ((-1 < lVar376 + -2 && auStack_410[lVar376 + -2] == 0) &&
              (&psStack_448)[lVar376] == (secp256k1_gej *)0x0) {
            psVar370 = (secp256k1_gej *)(ulong)(iVar365 - 1);
          }
          psStack_460 = (secp256k1_gej *)0x1239e8;
          iVar365 = (int)psVar370;
          psVar387 = psVar370;
          psVar372 = psVar366;
          iVar359 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar366,iVar365,
                               &secp256k1_const_modinfo_fe.modulus,0);
          if (iVar359 < 1) goto LAB_00123b87;
          psStack_460 = (secp256k1_gej *)0x123a02;
          psVar387 = psVar370;
          psVar372 = psVar366;
          iVar359 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar366,iVar365,
                               &secp256k1_const_modinfo_fe.modulus,1);
          if (0 < iVar359) goto LAB_00123b8c;
          psStack_460 = (secp256k1_gej *)0x123a19;
          psVar387 = psVar370;
          psVar372 = psVar386;
          iVar359 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar386,iVar365,
                               &secp256k1_const_modinfo_fe.modulus,0);
          if (iVar359 < 1) goto LAB_00123b91;
          psStack_460 = (secp256k1_gej *)0x123a33;
          psVar387 = psVar370;
          psVar372 = psVar386;
          iVar359 = secp256k1_modinv64_mul_cmp_62
                              ((secp256k1_modinv64_signed62 *)psVar386,iVar365,
                               &secp256k1_const_modinfo_fe.modulus,1);
          bVar353 = true;
          if (iVar359 < 0) goto LAB_00123a52;
          goto LAB_00123b96;
        }
        if (1 < iVar365) {
          psVar387 = (secp256k1_gej *)0x1;
          uVar357 = 0;
          do {
            uVar357 = uVar357 | auStack_410[(long)&psVar387[-1].field_0x97];
            psVar387 = (secp256k1_gej *)((long)(psVar387->x).n + 1);
          } while (psVar370 != psVar387);
          if (uVar357 != 0) goto LAB_001239be;
        }
        uStack_454 = 1 - (uVar358 * 2 & 2);
        bVar353 = false;
LAB_00123a52:
        uVar358 = uStack_454;
        if (!bVar353) goto LAB_00123a75;
        uVar358 = (int)uStack_450 + 1;
        uVar357 = (ulong)uVar358;
        psVar371 = psVar385;
      } while (uVar358 != 0xc);
      uVar358 = 0;
LAB_00123a75:
      if (uVar358 == 0) {
        psStack_460 = (secp256k1_gej *)0x123a8f;
        uVar358 = secp256k1_fe_sqrt((secp256k1_fe *)(auStack_440 + 0x28),(secp256k1_fe *)auStack_3e8
                                   );
        psVar371 = (secp256k1_gej *)(ulong)uVar358;
      }
      else {
        psVar371 = (secp256k1_gej *)(ulong)(~uVar358 >> 0x1f);
      }
    }
    psVar388 = (secp256k1_gej *)auStack_398;
    psStack_460 = (secp256k1_gej *)0x123aa1;
    secp256k1_fe_verify((secp256k1_fe *)psVar388);
    auStack_398._0_8_ = ((ulong)auStack_398._32_8_ >> 0x30) * 0x1000003d1 + auStack_398._0_8_;
    auStack_398._8_8_ = ((ulong)auStack_398._0_8_ >> 0x34) + auStack_398._8_8_;
    uVar357 = ((ulong)auStack_398._8_8_ >> 0x34) + auStack_398._16_8_;
    uVar360 = (uVar357 >> 0x34) + auStack_398._24_8_;
    auStack_398._24_8_ = uVar360 & 0xfffffffffffff;
    auStack_398._32_8_ = (uVar360 >> 0x34) + (auStack_398._32_8_ & 0xffffffffffff);
    auStack_398._16_8_ = uVar357 & 0xfffffffffffff;
    auStack_398._8_8_ = auStack_398._8_8_ & 0xfffffffffffff;
    auStack_398._0_8_ = auStack_398._0_8_ & 0xfffffffffffff;
    auStack_398._40_4_ = 1;
    psStack_460 = (secp256k1_gej *)0x123b2b;
    secp256k1_fe_verify((secp256k1_fe *)psVar388);
    psVar372 = (secp256k1_gej *)auStack_3e8;
    psStack_460 = (secp256k1_gej *)0x123b38;
    psVar387 = psVar388;
    iVar359 = secp256k1_fe_sqrt((secp256k1_fe *)psVar372,(secp256k1_fe *)psVar388);
    if ((int)psVar371 == iVar359) {
      return;
    }
  }
  psStack_460 = (secp256k1_gej *)0x123baa;
  secp256k1_fe_is_square_var_cold_18();
LAB_00123baa:
  psStack_460 = (secp256k1_gej *)secp256k1_ge_x_frac_on_curve_var;
  secp256k1_fe_is_square_var_cold_16();
  b = (secp256k1_fe *)0xfffffffffffff;
  psVar370 = (secp256k1_gej *)0x1000003d0;
  psStack_518 = (secp256k1_gej *)0x123be2;
  psStack_488 = psVar371;
  psStack_480 = psVar385;
  psStack_478 = psVar386;
  psStack_470 = psVar388;
  psStack_468 = psVar366;
  psStack_460 = psVar382;
  secp256k1_fe_verify(&psVar387->x);
  uVar357 = (psVar387->x).n[4];
  uVar360 = (uVar357 >> 0x30) * 0x1000003d1 + (psVar387->x).n[0];
  if (((uVar360 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar360 & 0xfffffffffffff) == 0)) {
    uVar361 = (uVar360 >> 0x34) + (psVar387->x).n[1];
    psVar366 = (secp256k1_gej *)((uVar361 >> 0x34) + (psVar387->x).n[2]);
    psVar371 = (secp256k1_gej *)(((ulong)psVar366 >> 0x34) + (psVar387->x).n[3]);
    uVar357 = ((ulong)psVar371 >> 0x34) + (uVar357 & 0xffffffffffff);
    if ((((uVar361 | uVar360 | (ulong)psVar366 | (ulong)psVar371) & 0xfffffffffffff) != 0 ||
         uVar357 != 0) &&
       (((uVar360 | 0x1000003d0) & uVar361 & (ulong)psVar366 & (ulong)psVar371 &
        (uVar357 ^ 0xf000000000000)) != 0xfffffffffffff)) goto LAB_00123c88;
  }
  else {
LAB_00123c88:
    psStack_518 = (secp256k1_gej *)0x123c98;
    psVar366 = psVar387;
    secp256k1_fe_mul((secp256k1_fe *)(auStack_4f0 + 0x30),&psVar387->x,&psVar372->x);
    psStack_518 = (secp256k1_gej *)0x123ca0;
    psVar371 = psVar372;
    secp256k1_fe_verify(&psVar372->x);
    if ((psVar372->x).magnitude < 9) {
      b = (secp256k1_fe *)auStack_4f0;
      uVar357 = (psVar372->x).n[0];
      uVar360 = (psVar372->x).n[1];
      psVar385 = (secp256k1_gej *)(psVar372->x).n[2];
      psVar386 = (secp256k1_gej *)(psVar372->x).n[3];
      uVar361 = (psVar372->x).n[4];
      psVar370 = (secp256k1_gej *)0xfffffffffffff;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar357 * 2;
      auVar179._8_8_ = 0;
      auVar179._0_8_ = psVar386;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar360 * 2;
      auVar180._8_8_ = 0;
      auVar180._0_8_ = psVar385;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar361;
      auVar181._8_8_ = 0;
      auVar181._0_8_ = uVar361;
      uVar362 = SUB168(auVar25 * auVar181,0);
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar362 & 0xfffffffffffff;
      auVar3 = auVar24 * auVar180 + auVar23 * auVar179 + auVar26 * ZEXT816(0x1000003d10);
      uVar369 = auVar3._0_8_;
      uStack_4f8 = uVar369 & 0xfffffffffffff;
      auVar298._8_8_ = 0;
      auVar298._0_8_ = uVar369 >> 0x34 | auVar3._8_8_ << 0xc;
      uVar361 = uVar361 * 2;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar357;
      auVar182._8_8_ = 0;
      auVar182._0_8_ = uVar361;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar360 * 2;
      auVar183._8_8_ = 0;
      auVar183._0_8_ = psVar386;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = psVar385;
      auVar184._8_8_ = 0;
      auVar184._0_8_ = psVar385;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar362 >> 0x34 | SUB168(auVar25 * auVar181,8) << 0xc;
      auVar3 = auVar27 * auVar182 + auVar298 + auVar28 * auVar183 + auVar29 * auVar184 +
               auVar30 * ZEXT816(0x1000003d10);
      uVar362 = auVar3._0_8_;
      auVar299._8_8_ = 0;
      auVar299._0_8_ = uVar362 >> 0x34 | auVar3._8_8_ << 0xc;
      uStack_508 = (uVar362 & 0xfffffffffffff) >> 0x30;
      psStack_500 = (secp256k1_gej *)(uVar362 & 0xffffffffffff);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar357;
      auVar185._8_8_ = 0;
      auVar185._0_8_ = uVar357;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar360;
      auVar186._8_8_ = 0;
      auVar186._0_8_ = uVar361;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = (long)psVar385 * 2;
      auVar187._8_8_ = 0;
      auVar187._0_8_ = psVar386;
      auVar3 = auVar32 * auVar186 + auVar299 + auVar33 * auVar187;
      uVar362 = auVar3._0_8_;
      auVar301._8_8_ = 0;
      auVar301._0_8_ = uVar362 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar188._8_8_ = 0;
      auVar188._0_8_ = (uVar362 & 0xfffffffffffff) << 4 | uStack_508;
      auVar3 = auVar31 * auVar185 + ZEXT816(0x1000003d1) * auVar188;
      uVar362 = auVar3._0_8_;
      auStack_4f0._0_8_ = uVar362 & 0xfffffffffffff;
      auVar300._8_8_ = 0;
      auVar300._0_8_ = uVar362 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar357 * 2;
      auVar189._8_8_ = 0;
      auVar189._0_8_ = uVar360;
      auVar35._8_8_ = 0;
      auVar35._0_8_ = psVar385;
      auVar190._8_8_ = 0;
      auVar190._0_8_ = uVar361;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = psVar386;
      auVar191._8_8_ = 0;
      auVar191._0_8_ = psVar386;
      auVar4 = auVar35 * auVar190 + auVar301 + auVar36 * auVar191;
      uVar362 = auVar4._0_8_;
      auVar37._8_8_ = 0;
      auVar37._0_8_ = uVar362 & 0xfffffffffffff;
      auVar3 = auVar34 * auVar189 + auVar300 + auVar37 * ZEXT816(0x1000003d10);
      uVar369 = auVar3._0_8_;
      auVar303._8_8_ = 0;
      auVar303._0_8_ = uVar362 >> 0x34 | auVar4._8_8_ << 0xc;
      auStack_4f0._8_8_ = uVar369 & 0xfffffffffffff;
      auVar302._8_8_ = 0;
      auVar302._0_8_ = uVar369 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = uVar357 * 2;
      auVar192._8_8_ = 0;
      auVar192._0_8_ = psVar385;
      auVar39._8_8_ = 0;
      auVar39._0_8_ = uVar360;
      auVar193._8_8_ = 0;
      auVar193._0_8_ = uVar360;
      auVar40._8_8_ = 0;
      auVar40._0_8_ = psVar386;
      auVar194._8_8_ = 0;
      auVar194._0_8_ = uVar361;
      auVar303 = auVar40 * auVar194 + auVar303;
      uVar357 = auVar303._0_8_;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = uVar357 & 0xfffffffffffff;
      auVar3 = auVar38 * auVar192 + auVar302 + auVar39 * auVar193 + auVar41 * ZEXT816(0x1000003d10);
      uVar360 = auVar3._0_8_;
      auStack_4f0._16_8_ = uVar360 & 0xfffffffffffff;
      auVar304._8_8_ = 0;
      auVar304._0_8_ = (uVar360 >> 0x34 | auVar3._8_8_ << 0xc) + uStack_4f8;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar357 >> 0x34 | auVar303._8_8_ << 0xc;
      auVar304 = auVar42 * ZEXT816(0x1000003d10) + auVar304;
      uVar357 = auVar304._0_8_;
      auStack_4f0._24_8_ = uVar357 & 0xfffffffffffff;
      auStack_4f0._32_8_ = (long)(psStack_500->x).n + (uVar357 >> 0x34 | auVar304._8_8_ << 0xc);
      auStack_4f0._40_8_ = 1;
      psStack_518 = (secp256k1_gej *)0x123eea;
      secp256k1_fe_verify(b);
      psVar366 = (secp256k1_gej *)(auStack_4f0 + 0x30);
      psStack_518 = (secp256k1_gej *)0x123efa;
      secp256k1_fe_mul((secp256k1_fe *)psVar366,(secp256k1_fe *)psVar366,b);
      psStack_518 = (secp256k1_gej *)0x123f02;
      psVar371 = psVar387;
      secp256k1_fe_verify(&psVar387->x);
      psVar372 = psVar387;
      if (8 < (psVar387->x).magnitude) goto LAB_0012445e;
      uVar357 = (psVar387->x).n[0];
      uVar360 = (psVar387->x).n[1];
      psVar382 = (secp256k1_gej *)(psVar387->x).n[2];
      psVar388 = (secp256k1_gej *)(psVar387->x).n[3];
      uVar361 = (psVar387->x).n[4];
      psVar370 = (secp256k1_gej *)0xfffffffffffff;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = uVar357 * 2;
      auVar195._8_8_ = 0;
      auVar195._0_8_ = psVar388;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = uVar360 * 2;
      auVar196._8_8_ = 0;
      auVar196._0_8_ = psVar382;
      auVar45._8_8_ = 0;
      auVar45._0_8_ = uVar361;
      auVar197._8_8_ = 0;
      auVar197._0_8_ = uVar361;
      uVar362 = SUB168(auVar45 * auVar197,0);
      auVar46._8_8_ = 0;
      auVar46._0_8_ = uVar362 & 0xfffffffffffff;
      auVar3 = auVar44 * auVar196 + auVar43 * auVar195 + auVar46 * ZEXT816(0x1000003d10);
      uVar369 = auVar3._0_8_;
      uStack_4f8 = uVar369 & 0xfffffffffffff;
      auVar305._8_8_ = 0;
      auVar305._0_8_ = uVar369 >> 0x34 | auVar3._8_8_ << 0xc;
      b = (secp256k1_fe *)(uVar361 * 2);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = uVar357;
      auVar198._8_8_ = 0;
      auVar198._0_8_ = b;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar360 * 2;
      auVar199._8_8_ = 0;
      auVar199._0_8_ = psVar388;
      auVar49._8_8_ = 0;
      auVar49._0_8_ = psVar382;
      auVar200._8_8_ = 0;
      auVar200._0_8_ = psVar382;
      auVar50._8_8_ = 0;
      auVar50._0_8_ = uVar362 >> 0x34 | SUB168(auVar45 * auVar197,8) << 0xc;
      auVar3 = auVar47 * auVar198 + auVar305 + auVar48 * auVar199 + auVar49 * auVar200 +
               auVar50 * ZEXT816(0x1000003d10);
      uVar361 = auVar3._0_8_;
      auVar306._8_8_ = 0;
      auVar306._0_8_ = uVar361 >> 0x34 | auVar3._8_8_ << 0xc;
      uStack_508 = (uVar361 & 0xfffffffffffff) >> 0x30;
      psVar366 = (secp256k1_gej *)(uVar361 & 0xffffffffffff);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar357;
      auVar201._8_8_ = 0;
      auVar201._0_8_ = uVar357;
      auVar52._8_8_ = 0;
      auVar52._0_8_ = uVar360;
      auVar202._8_8_ = 0;
      auVar202._0_8_ = b;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = (long)psVar382 * 2;
      auVar203._8_8_ = 0;
      auVar203._0_8_ = psVar388;
      auVar3 = auVar52 * auVar202 + auVar306 + auVar53 * auVar203;
      uVar361 = auVar3._0_8_;
      auVar308._8_8_ = 0;
      auVar308._0_8_ = uVar361 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar204._8_8_ = 0;
      auVar204._0_8_ = (uVar361 & 0xfffffffffffff) << 4 | uStack_508;
      auVar3 = auVar51 * auVar201 + ZEXT816(0x1000003d1) * auVar204;
      uVar361 = auVar3._0_8_;
      auStack_4f0._0_8_ = uVar361 & 0xfffffffffffff;
      auVar307._8_8_ = 0;
      auVar307._0_8_ = uVar361 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar54._8_8_ = 0;
      auVar54._0_8_ = uVar357 * 2;
      auVar205._8_8_ = 0;
      auVar205._0_8_ = uVar360;
      auVar55._8_8_ = 0;
      auVar55._0_8_ = psVar382;
      auVar206._8_8_ = 0;
      auVar206._0_8_ = b;
      auVar56._8_8_ = 0;
      auVar56._0_8_ = psVar388;
      auVar207._8_8_ = 0;
      auVar207._0_8_ = psVar388;
      auVar4 = auVar55 * auVar206 + auVar308 + auVar56 * auVar207;
      uVar361 = auVar4._0_8_;
      auVar57._8_8_ = 0;
      auVar57._0_8_ = uVar361 & 0xfffffffffffff;
      auVar3 = auVar54 * auVar205 + auVar307 + auVar57 * ZEXT816(0x1000003d10);
      uVar362 = auVar3._0_8_;
      auVar310._8_8_ = 0;
      auVar310._0_8_ = uVar361 >> 0x34 | auVar4._8_8_ << 0xc;
      auStack_4f0._8_8_ = uVar362 & 0xfffffffffffff;
      auVar309._8_8_ = 0;
      auVar309._0_8_ = uVar362 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar58._8_8_ = 0;
      auVar58._0_8_ = uVar357 * 2;
      auVar208._8_8_ = 0;
      auVar208._0_8_ = psVar382;
      auVar59._8_8_ = 0;
      auVar59._0_8_ = uVar360;
      auVar209._8_8_ = 0;
      auVar209._0_8_ = uVar360;
      auVar60._8_8_ = 0;
      auVar60._0_8_ = psVar388;
      auVar210._8_8_ = 0;
      auVar210._0_8_ = b;
      auVar310 = auVar60 * auVar210 + auVar310;
      uVar357 = auVar310._0_8_;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = uVar357 & 0xfffffffffffff;
      auVar3 = auVar58 * auVar208 + auVar309 + auVar59 * auVar209 + auVar61 * ZEXT816(0x1000003d10);
      uVar360 = auVar3._0_8_;
      psVar372 = (secp256k1_gej *)(uVar357 >> 0x34 | auVar310._8_8_ << 0xc);
      auStack_4f0._16_8_ = uVar360 & 0xfffffffffffff;
      auVar311._8_8_ = 0;
      auVar311._0_8_ = (uVar360 >> 0x34 | auVar3._8_8_ << 0xc) + uStack_4f8;
      auVar62._8_8_ = 0;
      auVar62._0_8_ = psVar372;
      auVar311 = auVar62 * ZEXT816(0x1000003d10) + auVar311;
      uVar357 = auVar311._0_8_;
      auStack_4f0._24_8_ = uVar357 & 0xfffffffffffff;
      auStack_4f0._32_8_ = (long)(psVar366->x).n + (uVar357 >> 0x34 | auVar311._8_8_ << 0xc);
      auStack_4f0._40_8_ = 1;
      psStack_518 = (secp256k1_gej *)0x124149;
      psStack_500 = psVar366;
      secp256k1_fe_verify((secp256k1_fe *)auStack_4f0);
      psStack_518 = (secp256k1_gej *)0x124151;
      psVar371 = (secp256k1_gej *)auStack_4f0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_4f0);
      psVar386 = (secp256k1_gej *)auStack_4f0._24_8_;
      psVar385 = (secp256k1_gej *)auStack_4f0._16_8_;
      psVar387 = (secp256k1_gej *)auStack_4f0;
      if (8 < (int)auStack_4f0._40_4_) goto LAB_00124463;
      psVar370 = (secp256k1_gej *)0xfffffffffffff;
      auVar63._8_8_ = 0;
      auVar63._0_8_ = auStack_4f0._0_8_ * 2;
      auVar211._8_8_ = 0;
      auVar211._0_8_ = auStack_4f0._24_8_;
      auVar64._8_8_ = 0;
      auVar64._0_8_ = auStack_4f0._8_8_ * 2;
      auVar212._8_8_ = 0;
      auVar212._0_8_ = auStack_4f0._16_8_;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = auStack_4f0._32_8_;
      auVar213._8_8_ = 0;
      auVar213._0_8_ = auStack_4f0._32_8_;
      uVar357 = SUB168(auVar65 * auVar213,0);
      auVar66._8_8_ = 0;
      auVar66._0_8_ = uVar357 & 0xfffffffffffff;
      auVar3 = auVar64 * auVar212 + auVar63 * auVar211 + auVar66 * ZEXT816(0x1000003d10);
      uVar360 = auVar3._0_8_;
      uStack_4f8 = uVar360 & 0xfffffffffffff;
      auVar312._8_8_ = 0;
      auVar312._0_8_ = uVar360 >> 0x34 | auVar3._8_8_ << 0xc;
      b = (secp256k1_fe *)(auStack_4f0._32_8_ * 2);
      auVar67._8_8_ = 0;
      auVar67._0_8_ = auStack_4f0._0_8_;
      auVar214._8_8_ = 0;
      auVar214._0_8_ = b;
      auVar68._8_8_ = 0;
      auVar68._0_8_ = auStack_4f0._8_8_ * 2;
      auVar215._8_8_ = 0;
      auVar215._0_8_ = auStack_4f0._24_8_;
      auVar69._8_8_ = 0;
      auVar69._0_8_ = auStack_4f0._16_8_;
      auVar216._8_8_ = 0;
      auVar216._0_8_ = auStack_4f0._16_8_;
      auVar70._8_8_ = 0;
      auVar70._0_8_ = uVar357 >> 0x34 | SUB168(auVar65 * auVar213,8) << 0xc;
      auVar3 = auVar67 * auVar214 + auVar312 + auVar68 * auVar215 + auVar69 * auVar216 +
               auVar70 * ZEXT816(0x1000003d10);
      uVar357 = auVar3._0_8_;
      auVar313._8_8_ = 0;
      auVar313._0_8_ = uVar357 >> 0x34 | auVar3._8_8_ << 0xc;
      uStack_508 = (uVar357 & 0xfffffffffffff) >> 0x30;
      psVar366 = (secp256k1_gej *)(uVar357 & 0xffffffffffff);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = auStack_4f0._0_8_;
      auVar217._8_8_ = 0;
      auVar217._0_8_ = auStack_4f0._0_8_;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = auStack_4f0._8_8_;
      auVar218._8_8_ = 0;
      auVar218._0_8_ = b;
      auVar73._8_8_ = 0;
      auVar73._0_8_ = auStack_4f0._16_8_ * 2;
      auVar219._8_8_ = 0;
      auVar219._0_8_ = auStack_4f0._24_8_;
      auVar3 = auVar72 * auVar218 + auVar313 + auVar73 * auVar219;
      uVar357 = auVar3._0_8_;
      auVar315._8_8_ = 0;
      auVar315._0_8_ = uVar357 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar220._8_8_ = 0;
      auVar220._0_8_ = (uVar357 & 0xfffffffffffff) << 4 | uStack_508;
      auVar3 = auVar71 * auVar217 + ZEXT816(0x1000003d1) * auVar220;
      uVar360 = auVar3._0_8_;
      auVar314._8_8_ = 0;
      auVar314._0_8_ = uVar360 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = auStack_4f0._0_8_ * 2;
      auVar221._8_8_ = 0;
      auVar221._0_8_ = auStack_4f0._8_8_;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = auStack_4f0._16_8_;
      auVar222._8_8_ = 0;
      auVar222._0_8_ = b;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = auStack_4f0._24_8_;
      auVar223._8_8_ = 0;
      auVar223._0_8_ = auStack_4f0._24_8_;
      auVar4 = auVar75 * auVar222 + auVar315 + auVar76 * auVar223;
      uVar357 = auVar4._0_8_;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = uVar357 & 0xfffffffffffff;
      auVar3 = auVar74 * auVar221 + auVar314 + auVar77 * ZEXT816(0x1000003d10);
      uVar361 = auVar3._0_8_;
      auVar317._8_8_ = 0;
      auVar317._0_8_ = uVar357 >> 0x34 | auVar4._8_8_ << 0xc;
      auVar316._8_8_ = 0;
      auVar316._0_8_ = uVar361 >> 0x34 | auVar3._8_8_ << 0xc;
      auVar78._8_8_ = 0;
      auVar78._0_8_ = auStack_4f0._0_8_ * 2;
      auVar224._8_8_ = 0;
      auVar224._0_8_ = auStack_4f0._16_8_;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = auStack_4f0._8_8_;
      auVar225._8_8_ = 0;
      auVar225._0_8_ = auStack_4f0._8_8_;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = auStack_4f0._24_8_;
      auVar226._8_8_ = 0;
      auVar226._0_8_ = b;
      auVar317 = auVar80 * auVar226 + auVar317;
      uVar357 = auVar317._0_8_;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = uVar357 & 0xfffffffffffff;
      auVar3 = auVar78 * auVar224 + auVar316 + auVar79 * auVar225 + auVar81 * ZEXT816(0x1000003d10);
      uVar362 = auVar3._0_8_;
      psVar372 = (secp256k1_gej *)(uVar357 >> 0x34 | auVar317._8_8_ << 0xc);
      auStack_4f0._16_8_ = uVar362 & 0xfffffffffffff;
      auVar318._8_8_ = 0;
      auVar318._0_8_ = (uVar362 >> 0x34 | auVar3._8_8_ << 0xc) + uStack_4f8;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = psVar372;
      auVar318 = auVar82 * ZEXT816(0x1000003d10) + auVar318;
      uVar357 = auVar318._0_8_;
      auStack_4f0._24_8_ = uVar357 & 0xfffffffffffff;
      auStack_4f0._32_8_ = (long)(psVar366->x).n + (uVar357 >> 0x34 | auVar318._8_8_ << 0xc);
      auStack_4f0._40_8_ = 1;
      psStack_518 = (secp256k1_gej *)0x124394;
      psStack_500 = psVar366;
      auStack_4f0._0_8_ = uVar360 & 0xfffffffffffff;
      auStack_4f0._8_8_ = uVar361 & 0xfffffffffffff;
      secp256k1_fe_verify((secp256k1_fe *)auStack_4f0);
      psStack_518 = (secp256k1_gej *)0x12439c;
      psVar371 = (secp256k1_gej *)auStack_4f0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_4f0);
      if (0x10 < (int)auStack_4f0._40_4_) goto LAB_00124468;
      psVar372 = (secp256k1_gej *)auStack_4f0;
      auStack_4f0._0_8_ = auStack_4f0._0_8_ * 2;
      auStack_4f0._8_8_ = auStack_4f0._8_8_ * 2;
      auStack_4f0._16_8_ = auStack_4f0._16_8_ * 2;
      auStack_4f0._24_8_ = auStack_4f0._24_8_ * 2;
      auStack_4f0._32_8_ = auStack_4f0._32_8_ << 1;
      auStack_4f0._44_4_ = 0;
      auStack_4f0._40_4_ = auStack_4f0._40_4_ * 2;
      psStack_518 = (secp256k1_gej *)0x1243e0;
      secp256k1_fe_verify((secp256k1_fe *)psVar372);
      b = (secp256k1_fe *)(auStack_4f0 + 0x30);
      psStack_518 = (secp256k1_gej *)0x1243ed;
      secp256k1_fe_verify(b);
      psStack_518 = (secp256k1_gej *)0x1243f5;
      psVar371 = psVar372;
      secp256k1_fe_verify((secp256k1_fe *)psVar372);
      iStack_498 = auStack_4f0._40_4_ + iStack_498;
      if (iStack_498 < 0x21) {
        auStack_4f0._48_8_ = auStack_4f0._48_8_ + auStack_4f0._0_8_;
        uStack_4b8 = uStack_4b8 + auStack_4f0._8_8_;
        uStack_4b0 = (long)((secp256k1_fe *)auStack_4f0._16_8_)->n + uStack_4b0;
        uStack_4a8 = (long)((secp256k1_fe *)auStack_4f0._24_8_)->n + uStack_4a8;
        uStack_4a0 = uStack_4a0 + auStack_4f0._32_8_;
        iStack_494 = 0;
        psStack_518 = (secp256k1_gej *)0x12443f;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_4f0 + 0x30));
        psStack_518 = (secp256k1_gej *)0x124447;
        secp256k1_fe_is_square_var((secp256k1_fe *)(auStack_4f0 + 0x30));
        return;
      }
    }
    else {
      psStack_518 = (secp256k1_gej *)0x12445e;
      secp256k1_ge_x_frac_on_curve_var_cold_6();
LAB_0012445e:
      psStack_518 = (secp256k1_gej *)0x124463;
      secp256k1_ge_x_frac_on_curve_var_cold_5();
      psVar382 = psVar385;
      psVar388 = psVar386;
LAB_00124463:
      psVar386 = psVar388;
      psVar385 = psVar382;
      psStack_518 = (secp256k1_gej *)0x124468;
      secp256k1_ge_x_frac_on_curve_var_cold_4();
LAB_00124468:
      psStack_518 = (secp256k1_gej *)0x12446d;
      secp256k1_ge_x_frac_on_curve_var_cold_3();
    }
    psStack_518 = (secp256k1_gej *)0x124472;
    secp256k1_ge_x_frac_on_curve_var_cold_2();
  }
  psStack_518 = (secp256k1_gej *)secp256k1_gej_add_var;
  secp256k1_ge_x_frac_on_curve_var_cold_1();
  psStack_7a0 = (secp256k1_gej *)0x124499;
  psVar382 = psVar366;
  psStack_540 = psVar372;
  psStack_538 = psVar385;
  psStack_530 = psVar386;
  psStack_528 = b;
  psStack_520 = psVar370;
  psStack_518 = psVar387;
  secp256k1_gej_verify(psVar366);
  psStack_7a0 = (secp256k1_gej *)0x1244a1;
  secp256k1_gej_verify(a);
  psVar387 = a;
  if ((psVar366->infinity != 0) || (psVar387 = psVar366, a->infinity != 0)) {
    memcpy(psVar371,psVar387,0x98);
    return;
  }
  psVar387 = (secp256k1_gej *)&a->z;
  psStack_7a0 = (secp256k1_gej *)0x1244f7;
  psVar372 = psVar387;
  psStack_798 = psVar371;
  psStack_790 = psVar366;
  secp256k1_fe_verify((secp256k1_fe *)psVar387);
  if ((a->z).magnitude < 9) {
    uVar357 = ((secp256k1_fe *)psVar387)->n[0];
    uVar360 = (a->z).n[1];
    psVar385 = (secp256k1_gej *)(a->z).n[2];
    psVar386 = (secp256k1_gej *)(a->z).n[3];
    uVar361 = (a->z).n[4];
    psVar370 = (secp256k1_gej *)0xfffffffffffff;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar357 * 2;
    auVar227._8_8_ = 0;
    auVar227._0_8_ = psVar386;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar360 * 2;
    auVar228._8_8_ = 0;
    auVar228._0_8_ = psVar385;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar361;
    auVar229._8_8_ = 0;
    auVar229._0_8_ = uVar361;
    uVar362 = SUB168(auVar85 * auVar229,0);
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar362 & 0xfffffffffffff;
    auVar3 = auVar84 * auVar228 + auVar83 * auVar227 + auVar86 * ZEXT816(0x1000003d10);
    uVar369 = auVar3._0_8_;
    auStack_5d8._56_8_ = uVar369 & 0xfffffffffffff;
    auVar319._8_8_ = 0;
    auVar319._0_8_ = uVar369 >> 0x34 | auVar3._8_8_ << 0xc;
    uVar361 = uVar361 * 2;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar357;
    auVar230._8_8_ = 0;
    auVar230._0_8_ = uVar361;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar360 * 2;
    auVar231._8_8_ = 0;
    auVar231._0_8_ = psVar386;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = psVar385;
    auVar232._8_8_ = 0;
    auVar232._0_8_ = psVar385;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar362 >> 0x34 | SUB168(auVar85 * auVar229,8) << 0xc;
    auVar3 = auVar87 * auVar230 + auVar319 + auVar88 * auVar231 + auVar89 * auVar232 +
             auVar90 * ZEXT816(0x1000003d10);
    uVar362 = auVar3._0_8_;
    auVar320._8_8_ = 0;
    auVar320._0_8_ = uVar362 >> 0x34 | auVar3._8_8_ << 0xc;
    auStack_6a8._0_8_ = (uVar362 & 0xfffffffffffff) >> 0x30;
    psVar382 = (secp256k1_gej *)(uVar362 & 0xffffffffffff);
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar357;
    auVar233._8_8_ = 0;
    auVar233._0_8_ = uVar357;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar360;
    auVar234._8_8_ = 0;
    auVar234._0_8_ = uVar361;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = (long)psVar385 * 2;
    auVar235._8_8_ = 0;
    auVar235._0_8_ = psVar386;
    auVar3 = auVar92 * auVar234 + auVar320 + auVar93 * auVar235;
    uVar362 = auVar3._0_8_;
    auVar322._8_8_ = 0;
    auVar322._0_8_ = uVar362 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar236._8_8_ = 0;
    auVar236._0_8_ = (uVar362 & 0xfffffffffffff) << 4 | auStack_6a8._0_8_;
    auVar3 = auVar91 * auVar233 + ZEXT816(0x1000003d1) * auVar236;
    uVar362 = auVar3._0_8_;
    sStack_570.n[0] = uVar362 & 0xfffffffffffff;
    auVar321._8_8_ = 0;
    auVar321._0_8_ = uVar362 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar357 * 2;
    auVar237._8_8_ = 0;
    auVar237._0_8_ = uVar360;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = psVar385;
    auVar238._8_8_ = 0;
    auVar238._0_8_ = uVar361;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = psVar386;
    auVar239._8_8_ = 0;
    auVar239._0_8_ = psVar386;
    auVar4 = auVar95 * auVar238 + auVar322 + auVar96 * auVar239;
    uVar362 = auVar4._0_8_;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar362 & 0xfffffffffffff;
    auVar3 = auVar94 * auVar237 + auVar321 + auVar97 * ZEXT816(0x1000003d10);
    uVar369 = auVar3._0_8_;
    auVar324._8_8_ = 0;
    auVar324._0_8_ = uVar362 >> 0x34 | auVar4._8_8_ << 0xc;
    sStack_570.n[1] = uVar369 & 0xfffffffffffff;
    auVar323._8_8_ = 0;
    auVar323._0_8_ = uVar369 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar357 * 2;
    auVar240._8_8_ = 0;
    auVar240._0_8_ = psVar385;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar360;
    auVar241._8_8_ = 0;
    auVar241._0_8_ = uVar360;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = psVar386;
    auVar242._8_8_ = 0;
    auVar242._0_8_ = uVar361;
    auVar324 = auVar100 * auVar242 + auVar324;
    uVar357 = auVar324._0_8_;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar357 & 0xfffffffffffff;
    auVar3 = auVar98 * auVar240 + auVar323 + auVar99 * auVar241 + auVar101 * ZEXT816(0x1000003d10);
    uVar360 = auVar3._0_8_;
    sStack_570.n[2] = uVar360 & 0xfffffffffffff;
    auVar325._8_8_ = 0;
    auVar325._0_8_ = (uVar360 >> 0x34 | auVar3._8_8_ << 0xc) + auStack_5d8._56_8_;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar357 >> 0x34 | auVar324._8_8_ << 0xc;
    auVar325 = auVar102 * ZEXT816(0x1000003d10) + auVar325;
    uVar357 = auVar325._0_8_;
    sStack_570.n[3] = uVar357 & 0xfffffffffffff;
    sStack_570.n[4] = (long)(psVar382->x).n + (uVar357 >> 0x34 | auVar325._8_8_ << 0xc);
    sStack_570.magnitude = 1;
    sStack_570.normalized = 0;
    psStack_7a0 = (secp256k1_gej *)0x124758;
    psStack_780 = psVar387;
    auStack_6a8._48_8_ = psVar382;
    secp256k1_fe_verify(&sStack_570);
    psVar366 = psStack_790;
    psVar387 = (secp256k1_gej *)&psStack_790->z;
    psStack_7a0 = (secp256k1_gej *)0x124769;
    psVar372 = psVar387;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    if (8 < (psVar366->z).magnitude) goto LAB_00125557;
    psVar386 = (secp256k1_gej *)(auStack_5d8 + 0x38);
    uVar357 = ((secp256k1_fe *)psVar387)->n[0];
    uVar360 = (psVar366->z).n[1];
    uVar361 = (psVar366->z).n[2];
    uVar362 = (psVar366->z).n[3];
    uVar369 = (psVar366->z).n[4];
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar357 * 2;
    auVar243._8_8_ = 0;
    auVar243._0_8_ = uVar362;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar360 * 2;
    auVar244._8_8_ = 0;
    auVar244._0_8_ = uVar361;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar369;
    auVar245._8_8_ = 0;
    auVar245._0_8_ = uVar369;
    uVar349 = SUB168(auVar105 * auVar245,0);
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar349 & 0xfffffffffffff;
    auVar3 = auVar104 * auVar244 + auVar103 * auVar243 + auVar106 * ZEXT816(0x1000003d10);
    uVar367 = auVar3._0_8_;
    auStack_6a8._48_8_ = uVar367 & 0xfffffffffffff;
    auVar326._8_8_ = 0;
    auVar326._0_8_ = uVar367 >> 0x34 | auVar3._8_8_ << 0xc;
    uVar369 = uVar369 * 2;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uVar357;
    auVar246._8_8_ = 0;
    auVar246._0_8_ = uVar369;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar360 * 2;
    auVar247._8_8_ = 0;
    auVar247._0_8_ = uVar362;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar361;
    auVar248._8_8_ = 0;
    auVar248._0_8_ = uVar361;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar349 >> 0x34 | SUB168(auVar105 * auVar245,8) << 0xc;
    auVar3 = auVar107 * auVar246 + auVar326 + auVar108 * auVar247 + auVar109 * auVar248 +
             auVar110 * ZEXT816(0x1000003d10);
    auStack_6a8._0_8_ = auVar3._0_8_;
    auVar327._8_8_ = 0;
    auVar327._0_8_ = (ulong)auStack_6a8._0_8_ >> 0x34 | auVar3._8_8_ << 0xc;
    auStack_708._48_8_ = (auStack_6a8._0_8_ & 0xfffffffffffff) >> 0x30;
    auStack_6a8._0_8_ = auStack_6a8._0_8_ & 0xffffffffffff;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar357;
    auVar249._8_8_ = 0;
    auVar249._0_8_ = uVar357;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar360;
    auVar250._8_8_ = 0;
    auVar250._0_8_ = uVar369;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar361 * 2;
    auVar251._8_8_ = 0;
    auVar251._0_8_ = uVar362;
    auVar3 = auVar112 * auVar250 + auVar327 + auVar113 * auVar251;
    uVar349 = auVar3._0_8_;
    auVar329._8_8_ = 0;
    auVar329._0_8_ = uVar349 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar252._8_8_ = 0;
    auVar252._0_8_ = (uVar349 & 0xfffffffffffff) << 4 | auStack_708._48_8_;
    auVar3 = auVar111 * auVar249 + ZEXT816(0x1000003d1) * auVar252;
    uVar349 = auVar3._0_8_;
    auStack_5d8._56_8_ = uVar349 & 0xfffffffffffff;
    auVar328._8_8_ = 0;
    auVar328._0_8_ = uVar349 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar357 * 2;
    auVar253._8_8_ = 0;
    auVar253._0_8_ = uVar360;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar361;
    auVar254._8_8_ = 0;
    auVar254._0_8_ = uVar369;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar362;
    auVar255._8_8_ = 0;
    auVar255._0_8_ = uVar362;
    auVar4 = auVar115 * auVar254 + auVar329 + auVar116 * auVar255;
    uVar349 = auVar4._0_8_;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uVar349 & 0xfffffffffffff;
    auVar3 = auVar114 * auVar253 + auVar328 + auVar117 * ZEXT816(0x1000003d10);
    uVar367 = auVar3._0_8_;
    auVar331._8_8_ = 0;
    auVar331._0_8_ = uVar349 >> 0x34 | auVar4._8_8_ << 0xc;
    uStack_598 = uVar367 & 0xfffffffffffff;
    auVar330._8_8_ = 0;
    auVar330._0_8_ = uVar367 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uVar357 * 2;
    auVar256._8_8_ = 0;
    auVar256._0_8_ = uVar361;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar360;
    auVar257._8_8_ = 0;
    auVar257._0_8_ = uVar360;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar362;
    auVar258._8_8_ = 0;
    auVar258._0_8_ = uVar369;
    auVar331 = auVar120 * auVar258 + auVar331;
    uVar357 = auVar331._0_8_;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar357 & 0xfffffffffffff;
    auVar3 = auVar118 * auVar256 + auVar330 + auVar119 * auVar257 + auVar121 * ZEXT816(0x1000003d10)
    ;
    uVar360 = auVar3._0_8_;
    uStack_590 = uVar360 & 0xfffffffffffff;
    auVar332._8_8_ = 0;
    auVar332._0_8_ =
         (long)(((secp256k1_gej *)auStack_6a8._48_8_)->x).n +
         (uVar360 >> 0x34 | auVar3._8_8_ << 0xc);
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar357 >> 0x34 | auVar331._8_8_ << 0xc;
    auVar332 = auVar122 * ZEXT816(0x1000003d10) + auVar332;
    uVar357 = auVar332._0_8_;
    uStack_588 = uVar357 & 0xfffffffffffff;
    lStack_580 = (uVar357 >> 0x34 | auVar332._8_8_ << 0xc) + auStack_6a8._0_8_;
    uStack_578 = 1;
    psStack_7a0 = (secp256k1_gej *)0x1249ce;
    psStack_788 = psVar387;
    secp256k1_fe_verify((secp256k1_fe *)psVar386);
    psVar366 = psStack_790;
    psVar387 = (secp256k1_gej *)(auStack_6a8 + 0x30);
    psStack_7a0 = (secp256k1_gej *)0x1249f1;
    secp256k1_fe_mul((secp256k1_fe *)psVar387,&psStack_790->x,&sStack_570);
    psStack_7a0 = (secp256k1_gej *)0x124a04;
    secp256k1_fe_mul((secp256k1_fe *)auStack_6a8,&a->x,(secp256k1_fe *)psVar386);
    psVar370 = (secp256k1_gej *)(auStack_708 + 0x30);
    psStack_7a0 = (secp256k1_gej *)0x124a1b;
    secp256k1_fe_mul((secp256k1_fe *)psVar370,&psVar366->y,&sStack_570);
    psVar385 = psStack_780;
    psStack_7a0 = (secp256k1_gej *)0x124a2e;
    secp256k1_fe_mul((secp256k1_fe *)psVar370,(secp256k1_fe *)psVar370,&psStack_780->x);
    psVar366 = (secp256k1_gej *)(auStack_648 + 0x40);
    psStack_7a0 = (secp256k1_gej *)0x124a48;
    secp256k1_fe_mul((secp256k1_fe *)psVar366,&a->y,(secp256k1_fe *)psVar386);
    psStack_7a0 = (secp256k1_gej *)0x124a58;
    psVar382 = psVar366;
    secp256k1_fe_mul((secp256k1_fe *)psVar366,(secp256k1_fe *)psVar366,&psStack_788->x);
    psStack_7a0 = (secp256k1_gej *)0x124a60;
    psVar372 = psVar387;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    if (1 < iStack_650) goto LAB_0012555c;
    psVar370 = (secp256k1_gej *)0x3fffffffffffc;
    auStack_708._0_8_ = 0x3ffffbfffff0bc - auStack_6a8._48_8_;
    auStack_708._8_8_ = 0x3ffffffffffffc - uStack_670;
    psVar387 = (secp256k1_gej *)auStack_708;
    auStack_708._16_8_ = 0x3ffffffffffffc - uStack_668;
    auStack_708._24_8_ = 0x3ffffffffffffc - uStack_660;
    auStack_708._32_8_ = 0x3fffffffffffc - uStack_658;
    auStack_708._40_8_ = 2;
    psStack_7a0 = (secp256k1_gej *)0x124ac6;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    psStack_7a0 = (secp256k1_gej *)0x124ace;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    psVar366 = (secp256k1_gej *)auStack_6a8;
    psStack_7a0 = (secp256k1_gej *)0x124ade;
    psVar372 = psVar366;
    secp256k1_fe_verify((secp256k1_fe *)psVar366);
    if (0x20 < (int)(auStack_6a8._40_4_ + auStack_708._40_4_)) goto LAB_00125561;
    auStack_708._0_8_ = auStack_708._0_8_ + auStack_6a8._0_8_;
    auStack_708._8_8_ = auStack_708._8_8_ + auStack_6a8._8_8_;
    auStack_708._16_8_ = (long)((secp256k1_fe *)auStack_708._16_8_)->n + auStack_6a8._16_8_;
    auStack_708._24_8_ = (long)((secp256k1_fe *)auStack_708._24_8_)->n + auStack_6a8._24_8_;
    auStack_708._32_8_ = auStack_708._32_8_ + auStack_6a8._32_8_;
    auStack_708._44_4_ = 0;
    auStack_708._40_4_ = auStack_6a8._40_4_ + auStack_708._40_4_;
    psStack_7a0 = (secp256k1_gej *)0x124b35;
    secp256k1_fe_verify((secp256k1_fe *)auStack_708);
    psVar387 = (secp256k1_gej *)(auStack_648 + 0x40);
    psStack_7a0 = (secp256k1_gej *)0x124b45;
    psVar372 = psVar387;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    if (1 < iStack_5e0) goto LAB_00125566;
    auStack_768._48_8_ = 0x3ffffbfffff0bc - auStack_648._64_8_;
    uStack_730 = 0x3ffffffffffffc - uStack_600;
    psVar387 = (secp256k1_gej *)(auStack_768 + 0x30);
    psStack_728 = (secp256k1_gej *)(0x3ffffffffffffc - uStack_5f8);
    psStack_720 = (secp256k1_gej *)(0x3ffffffffffffc - lStack_5f0);
    uStack_718 = 0x3fffffffffffc - uStack_5e8;
    uStack_710 = 2;
    psStack_7a0 = (secp256k1_gej *)0x124b9e;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    psStack_7a0 = (secp256k1_gej *)0x124ba6;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    psVar366 = (secp256k1_gej *)(auStack_708 + 0x30);
    psStack_7a0 = (secp256k1_gej *)0x124bb6;
    psVar372 = psVar366;
    secp256k1_fe_verify((secp256k1_fe *)psVar366);
    if (0x20 < iStack_6b0 + (int)uStack_710) goto LAB_0012556b;
    auStack_768._48_8_ = auStack_768._48_8_ + auStack_708._48_8_;
    uStack_730 = uStack_730 + uStack_6d0;
    psStack_728 = (secp256k1_gej *)((long)(psStack_728->x).n + uStack_6c8);
    psStack_720 = (secp256k1_gej *)((long)(psStack_720->x).n + uStack_6c0);
    uStack_718 = uStack_718 + uStack_6b8;
    uStack_710 = (ulong)(uint)(iStack_6b0 + (int)uStack_710);
    psStack_7a0 = (secp256k1_gej *)0x124c1e;
    secp256k1_fe_verify((secp256k1_fe *)(auStack_768 + 0x30));
    psStack_7a0 = (secp256k1_gej *)0x124c2e;
    secp256k1_fe_verify((secp256k1_fe *)auStack_708);
    psVar370 = psStack_798;
    uVar357 = ((ulong)auStack_708._32_8_ >> 0x30) * 0x1000003d1 + auStack_708._0_8_;
    if (((uVar357 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar357 & 0xfffffffffffff) == 0)) {
      uVar360 = (uVar357 >> 0x34) + auStack_708._8_8_;
      uVar361 = (long)((secp256k1_fe *)auStack_708._16_8_)->n + (uVar360 >> 0x34);
      uVar362 = (long)((secp256k1_fe *)auStack_708._24_8_)->n + (uVar361 >> 0x34);
      uVar369 = (uVar362 >> 0x34) + (auStack_708._32_8_ & 0xffffffffffff);
      if ((((uVar360 | uVar357 | uVar361 | uVar362) & 0xfffffffffffff) == 0 && uVar369 == 0) ||
         (((uVar357 | 0x1000003d0) & uVar360 & uVar361 & uVar362 & (uVar369 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        psStack_7a0 = (secp256k1_gej *)0x12549d;
        secp256k1_fe_verify((secp256k1_fe *)(auStack_768 + 0x30));
        uVar357 = (uStack_718 >> 0x30) * 0x1000003d1 + auStack_768._48_8_;
        if (((uVar357 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar357 & 0xfffffffffffff) == 0))
        {
          uVar360 = (uVar357 >> 0x34) + uStack_730;
          uVar361 = (long)(psStack_728->x).n + (uVar360 >> 0x34);
          uVar362 = (long)(psStack_720->x).n + (uVar361 >> 0x34);
          uVar369 = (uVar362 >> 0x34) + (uStack_718 & 0xffffffffffff);
          if ((((uVar360 | uVar357 | uVar361 | uVar362) & 0xfffffffffffff) == 0 && uVar369 == 0) ||
             (((uVar357 | 0x1000003d0) & uVar360 & uVar361 & uVar362 & (uVar369 ^ 0xf000000000000))
              == 0xfffffffffffff)) {
            psStack_7a0 = (secp256k1_gej *)0x125540;
            secp256k1_gej_double_var(psStack_798,psStack_790,(secp256k1_fe *)0x0);
            return;
          }
        }
        psStack_7a0 = (secp256k1_gej *)0x12552e;
        secp256k1_gej_set_infinity(psStack_798);
        return;
      }
    }
    psStack_798->infinity = 0;
    psVar366 = (secp256k1_gej *)auStack_648;
    psVar387 = (secp256k1_gej *)auStack_708;
    psStack_7a0 = (secp256k1_gej *)0x124d10;
    secp256k1_fe_mul((secp256k1_fe *)psVar366,(secp256k1_fe *)psVar387,&psVar385->x);
    psStack_7a0 = (secp256k1_gej *)0x124d21;
    psVar382 = psStack_788;
    secp256k1_fe_mul(&psVar370->z,&psStack_788->x,(secp256k1_fe *)psVar366);
    psStack_7a0 = (secp256k1_gej *)0x124d29;
    psVar372 = psVar387;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    psVar388 = (secp256k1_gej *)auStack_708._24_8_;
    psVar371 = (secp256k1_gej *)auStack_708._16_8_;
    psVar386 = (secp256k1_gej *)0x1000003d1;
    if (8 < (int)auStack_708._40_4_) goto LAB_00125570;
    psVar372 = (secp256k1_gej *)auStack_5d8;
    psVar370 = (secp256k1_gej *)0xfffffffffffff;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = auStack_708._0_8_ * 2;
    auVar259._8_8_ = 0;
    auVar259._0_8_ = auStack_708._24_8_;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = auStack_708._8_8_ * 2;
    auVar260._8_8_ = 0;
    auVar260._0_8_ = auStack_708._16_8_;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = auStack_708._32_8_;
    auVar261._8_8_ = 0;
    auVar261._0_8_ = auStack_708._32_8_;
    uVar357 = SUB168(auVar125 * auVar261,0);
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uVar357 & 0xfffffffffffff;
    auVar3 = auVar124 * auVar260 + auVar123 * auVar259 + auVar126 * ZEXT816(0x1000003d10);
    uVar360 = auVar3._0_8_;
    auStack_768._0_8_ = uVar360 & 0xfffffffffffff;
    auVar333._8_8_ = 0;
    auVar333._0_8_ = uVar360 >> 0x34 | auVar3._8_8_ << 0xc;
    psVar366 = (secp256k1_gej *)(auStack_708._32_8_ * 2);
    auVar127._8_8_ = 0;
    auVar127._0_8_ = auStack_708._0_8_;
    auVar262._8_8_ = 0;
    auVar262._0_8_ = psVar366;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = auStack_708._8_8_ * 2;
    auVar263._8_8_ = 0;
    auVar263._0_8_ = auStack_708._24_8_;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = auStack_708._16_8_;
    auVar264._8_8_ = 0;
    auVar264._0_8_ = auStack_708._16_8_;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar357 >> 0x34 | SUB168(auVar125 * auVar261,8) << 0xc;
    auVar3 = auVar127 * auVar262 + auVar333 + auVar128 * auVar263 + auVar129 * auVar264 +
             auVar130 * ZEXT816(0x1000003d10);
    uVar357 = auVar3._0_8_;
    auVar334._8_8_ = 0;
    auVar334._0_8_ = uVar357 >> 0x34 | auVar3._8_8_ << 0xc;
    psStack_778 = (secp256k1_gej *)((uVar357 & 0xfffffffffffff) >> 0x30);
    psVar382 = (secp256k1_gej *)(uVar357 & 0xffffffffffff);
    auVar131._8_8_ = 0;
    auVar131._0_8_ = auStack_708._0_8_;
    auVar265._8_8_ = 0;
    auVar265._0_8_ = auStack_708._0_8_;
    auVar132._8_8_ = 0;
    auVar132._0_8_ = auStack_708._8_8_;
    auVar266._8_8_ = 0;
    auVar266._0_8_ = psVar366;
    auVar133._8_8_ = 0;
    auVar133._0_8_ = auStack_708._16_8_ * 2;
    auVar267._8_8_ = 0;
    auVar267._0_8_ = auStack_708._24_8_;
    auVar3 = auVar132 * auVar266 + auVar334 + auVar133 * auVar267;
    uVar357 = auVar3._0_8_;
    auVar336._8_8_ = 0;
    auVar336._0_8_ = uVar357 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar268._8_8_ = 0;
    auVar268._0_8_ = (uVar357 & 0xfffffffffffff) << 4 | (ulong)psStack_778;
    auVar3 = auVar131 * auVar265 + ZEXT816(0x1000003d1) * auVar268;
    uVar357 = auVar3._0_8_;
    auStack_5d8._0_8_ = uVar357 & 0xfffffffffffff;
    auVar335._8_8_ = 0;
    auVar335._0_8_ = uVar357 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar134._8_8_ = 0;
    auVar134._0_8_ = auStack_708._0_8_ * 2;
    auVar269._8_8_ = 0;
    auVar269._0_8_ = auStack_708._8_8_;
    auVar135._8_8_ = 0;
    auVar135._0_8_ = auStack_708._16_8_;
    auVar270._8_8_ = 0;
    auVar270._0_8_ = psVar366;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auStack_708._24_8_;
    auVar271._8_8_ = 0;
    auVar271._0_8_ = auStack_708._24_8_;
    auVar4 = auVar135 * auVar270 + auVar336 + auVar136 * auVar271;
    uVar357 = auVar4._0_8_;
    auVar137._8_8_ = 0;
    auVar137._0_8_ = uVar357 & 0xfffffffffffff;
    auVar3 = auVar134 * auVar269 + auVar335 + auVar137 * ZEXT816(0x1000003d10);
    uVar360 = auVar3._0_8_;
    auVar338._8_8_ = 0;
    auVar338._0_8_ = uVar357 >> 0x34 | auVar4._8_8_ << 0xc;
    auStack_5d8._8_8_ = uVar360 & 0xfffffffffffff;
    auVar337._8_8_ = 0;
    auVar337._0_8_ = uVar360 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = auStack_708._0_8_ * 2;
    auVar272._8_8_ = 0;
    auVar272._0_8_ = auStack_708._16_8_;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = auStack_708._8_8_;
    auVar273._8_8_ = 0;
    auVar273._0_8_ = auStack_708._8_8_;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = auStack_708._24_8_;
    auVar274._8_8_ = 0;
    auVar274._0_8_ = psVar366;
    auVar338 = auVar140 * auVar274 + auVar338;
    uVar357 = auVar338._0_8_;
    auVar141._8_8_ = 0;
    auVar141._0_8_ = uVar357 & 0xfffffffffffff;
    auVar3 = auVar138 * auVar272 + auVar337 + auVar139 * auVar273 + auVar141 * ZEXT816(0x1000003d10)
    ;
    uVar360 = auVar3._0_8_;
    psVar387 = (secp256k1_gej *)(uVar357 >> 0x34 | auVar338._8_8_ << 0xc);
    auStack_5d8._16_8_ = uVar360 & 0xfffffffffffff;
    auVar339._8_8_ = 0;
    auVar339._0_8_ = (uVar360 >> 0x34 | auVar3._8_8_ << 0xc) + auStack_768._0_8_;
    auVar142._8_8_ = 0;
    auVar142._0_8_ = psVar387;
    auVar339 = auVar142 * ZEXT816(0x1000003d10) + auVar339;
    uVar357 = auVar339._0_8_;
    auStack_5d8._24_8_ = uVar357 & 0xfffffffffffff;
    auStack_5d8._32_8_ = (long)(psVar382->x).n + (uVar357 >> 0x34 | auVar339._8_8_ << 0xc);
    auStack_5d8._40_4_ = 1;
    auStack_5d8._44_4_ = 0;
    psStack_7a0 = (secp256k1_gej *)0x124f73;
    psStack_770 = psVar382;
    secp256k1_fe_verify((secp256k1_fe *)psVar372);
    psStack_7a0 = (secp256k1_gej *)0x124f7b;
    secp256k1_fe_verify((secp256k1_fe *)psVar372);
    if (1 < (int)auStack_5d8._40_4_) goto LAB_00125575;
    auStack_5d8._0_8_ = 0x3ffffbfffff0bc - auStack_5d8._0_8_;
    auStack_5d8._8_8_ = 0x3ffffffffffffc - auStack_5d8._8_8_;
    auStack_5d8._16_8_ = 0x3ffffffffffffc - auStack_5d8._16_8_;
    auStack_5d8._24_8_ = 0x3ffffffffffffc - auStack_5d8._24_8_;
    auStack_5d8._32_8_ = 0x3fffffffffffc - auStack_5d8._32_8_;
    auStack_5d8._40_4_ = 2;
    auStack_5d8._44_4_ = 0;
    psStack_7a0 = (secp256k1_gej *)0x124fd1;
    secp256k1_fe_verify((secp256k1_fe *)auStack_5d8);
    psStack_7a0 = (secp256k1_gej *)0x124fe6;
    secp256k1_fe_mul((secp256k1_fe *)auStack_768,(secp256k1_fe *)auStack_5d8,
                     (secp256k1_fe *)auStack_708);
    psVar382 = (secp256k1_gej *)(auStack_6a8 + 0x30);
    psStack_7a0 = (secp256k1_gej *)0x124ffe;
    secp256k1_fe_mul((secp256k1_fe *)auStack_648,(secp256k1_fe *)psVar382,
                     (secp256k1_fe *)auStack_5d8);
    psVar387 = (secp256k1_gej *)(auStack_768 + 0x30);
    psStack_7a0 = (secp256k1_gej *)0x12500b;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    psVar350 = psStack_720;
    psVar386 = psStack_728;
    psVar385 = psStack_798;
    psVar372 = psStack_798;
    if (8 < (int)uStack_710) goto LAB_0012557a;
    auVar143._8_8_ = 0;
    auVar143._0_8_ = auStack_768._48_8_ * 2;
    auVar275._8_8_ = 0;
    auVar275._0_8_ = psStack_720;
    auVar144._8_8_ = 0;
    auVar144._0_8_ = uStack_730 * 2;
    auVar276._8_8_ = 0;
    auVar276._0_8_ = psStack_728;
    auVar145._8_8_ = 0;
    auVar145._0_8_ = uStack_718;
    auVar277._8_8_ = 0;
    auVar277._0_8_ = uStack_718;
    uVar357 = SUB168(auVar145 * auVar277,0);
    auVar146._8_8_ = 0;
    auVar146._0_8_ = uVar357 & 0xfffffffffffff;
    auVar3 = auVar144 * auVar276 + auVar143 * auVar275 + auVar146 * ZEXT816(0x1000003d10);
    uVar360 = auVar3._0_8_;
    psStack_770 = (secp256k1_gej *)(uVar360 & 0xfffffffffffff);
    auVar340._8_8_ = 0;
    auVar340._0_8_ = uVar360 >> 0x34 | auVar3._8_8_ << 0xc;
    psVar366 = (secp256k1_gej *)(uStack_718 * 2);
    auVar147._8_8_ = 0;
    auVar147._0_8_ = auStack_768._48_8_;
    auVar278._8_8_ = 0;
    auVar278._0_8_ = psVar366;
    auVar148._8_8_ = 0;
    auVar148._0_8_ = uStack_730 * 2;
    auVar279._8_8_ = 0;
    auVar279._0_8_ = psStack_720;
    auVar149._8_8_ = 0;
    auVar149._0_8_ = psStack_728;
    auVar280._8_8_ = 0;
    auVar280._0_8_ = psStack_728;
    auVar150._8_8_ = 0;
    auVar150._0_8_ = uVar357 >> 0x34 | SUB168(auVar145 * auVar277,8) << 0xc;
    auVar3 = auVar147 * auVar278 + auVar340 + auVar148 * auVar279 + auVar149 * auVar280 +
             auVar150 * ZEXT816(0x1000003d10);
    uVar357 = auVar3._0_8_;
    auVar341._8_8_ = 0;
    auVar341._0_8_ = uVar357 >> 0x34 | auVar3._8_8_ << 0xc;
    auStack_648._56_8_ = (uVar357 & 0xfffffffffffff) >> 0x30;
    psVar382 = (secp256k1_gej *)(uVar357 & 0xffffffffffff);
    auVar151._8_8_ = 0;
    auVar151._0_8_ = auStack_768._48_8_;
    auVar281._8_8_ = 0;
    auVar281._0_8_ = auStack_768._48_8_;
    auVar152._8_8_ = 0;
    auVar152._0_8_ = uStack_730;
    auVar282._8_8_ = 0;
    auVar282._0_8_ = psVar366;
    auVar153._8_8_ = 0;
    auVar153._0_8_ = (long)psStack_728 * 2;
    auVar283._8_8_ = 0;
    auVar283._0_8_ = psStack_720;
    auVar3 = auVar152 * auVar282 + auVar341 + auVar153 * auVar283;
    uVar357 = auVar3._0_8_;
    auVar343._8_8_ = 0;
    auVar343._0_8_ = uVar357 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar284._8_8_ = 0;
    auVar284._0_8_ = (uVar357 & 0xfffffffffffff) << 4 | auStack_648._56_8_;
    auVar3 = auVar151 * auVar281 + ZEXT816(0x1000003d1) * auVar284;
    uVar357 = auVar3._0_8_;
    (psStack_798->x).n[0] = uVar357 & 0xfffffffffffff;
    auVar342._8_8_ = 0;
    auVar342._0_8_ = uVar357 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = auStack_768._48_8_ * 2;
    auVar285._8_8_ = 0;
    auVar285._0_8_ = uStack_730;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = psStack_728;
    auVar286._8_8_ = 0;
    auVar286._0_8_ = psVar366;
    auVar156._8_8_ = 0;
    auVar156._0_8_ = psStack_720;
    auVar287._8_8_ = 0;
    auVar287._0_8_ = psStack_720;
    auVar4 = auVar155 * auVar286 + auVar343 + auVar156 * auVar287;
    uVar357 = auVar4._0_8_;
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar357 & 0xfffffffffffff;
    auVar3 = auVar154 * auVar285 + auVar342 + auVar157 * ZEXT816(0x1000003d10);
    uVar360 = auVar3._0_8_;
    auVar345._8_8_ = 0;
    auVar345._0_8_ = uVar357 >> 0x34 | auVar4._8_8_ << 0xc;
    (psStack_798->x).n[1] = uVar360 & 0xfffffffffffff;
    auVar344._8_8_ = 0;
    auVar344._0_8_ = uVar360 >> 0x34 | auVar3._8_8_ << 0xc;
    auVar158._8_8_ = 0;
    auVar158._0_8_ = auStack_768._48_8_ * 2;
    auVar288._8_8_ = 0;
    auVar288._0_8_ = psStack_728;
    auVar159._8_8_ = 0;
    auVar159._0_8_ = uStack_730;
    auVar289._8_8_ = 0;
    auVar289._0_8_ = uStack_730;
    auVar160._8_8_ = 0;
    auVar160._0_8_ = psStack_720;
    auVar290._8_8_ = 0;
    auVar290._0_8_ = psVar366;
    auVar345 = auVar160 * auVar290 + auVar345;
    uVar357 = auVar345._0_8_;
    auVar161._8_8_ = 0;
    auVar161._0_8_ = uVar357 & 0xfffffffffffff;
    auVar3 = auVar158 * auVar288 + auVar344 + auVar159 * auVar289 + auVar161 * ZEXT816(0x1000003d10)
    ;
    uVar360 = auVar3._0_8_;
    (psStack_798->x).n[2] = uVar360 & 0xfffffffffffff;
    auVar346._8_8_ = 0;
    auVar346._0_8_ = (long)(psStack_770->x).n + (uVar360 >> 0x34 | auVar3._8_8_ << 0xc);
    auVar162._8_8_ = 0;
    auVar162._0_8_ = uVar357 >> 0x34 | auVar345._8_8_ << 0xc;
    auVar346 = auVar162 * ZEXT816(0x1000003d10) + auVar346;
    uVar357 = auVar346._0_8_;
    (psStack_798->x).n[3] = uVar357 & 0xfffffffffffff;
    (psStack_798->x).n[4] = (long)(psVar382->x).n + (uVar357 >> 0x34 | auVar346._8_8_ << 0xc);
    (psStack_798->x).magnitude = 1;
    (psStack_798->x).normalized = 0;
    psStack_7a0 = (secp256k1_gej *)0x12525b;
    psStack_778 = psVar382;
    secp256k1_fe_verify(&psStack_798->x);
    psStack_7a0 = (secp256k1_gej *)0x125263;
    secp256k1_fe_verify(&psVar385->x);
    psVar387 = (secp256k1_gej *)auStack_768;
    psStack_7a0 = (secp256k1_gej *)0x125270;
    psVar372 = psVar387;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    iVar359 = auStack_768._40_4_ + (psVar385->x).magnitude;
    if (0x20 < iVar359) goto LAB_0012557f;
    uVar1 = (psVar385->x).n[1];
    uVar2 = (psVar385->x).n[2];
    uVar347 = (psVar385->x).n[3];
    (psVar385->x).n[0] = (psVar385->x).n[0] + auStack_768._0_8_;
    (psVar385->x).n[1] = uVar1 + auStack_768._8_8_;
    (psVar385->x).n[2] = uVar2 + auStack_768._16_8_;
    (psVar385->x).n[3] = uVar347 + auStack_768._24_8_;
    puVar378 = (psVar385->x).n + 4;
    *puVar378 = *puVar378 + auStack_768._32_8_;
    (psVar385->x).magnitude = iVar359;
    (psVar385->x).normalized = 0;
    psStack_7a0 = (secp256k1_gej *)0x1252bf;
    secp256k1_fe_verify(&psVar385->x);
    psStack_7a0 = (secp256k1_gej *)0x1252c7;
    secp256k1_fe_verify(&psVar385->x);
    psVar387 = (secp256k1_gej *)auStack_648;
    psStack_7a0 = (secp256k1_gej *)0x1252d7;
    psVar372 = psVar387;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    iVar359 = auStack_648._40_4_ + (psVar385->x).magnitude;
    if (0x20 < iVar359) goto LAB_00125584;
    uVar1 = (psVar385->x).n[1];
    uVar2 = (psVar385->x).n[2];
    uVar347 = (psVar385->x).n[3];
    psVar387 = (secp256k1_gej *)auStack_648;
    (psVar385->x).n[0] = (psVar385->x).n[0] + auStack_648._0_8_;
    (psVar385->x).n[1] = uVar1 + auStack_648._8_8_;
    (psVar385->x).n[2] = uVar2 + auStack_648._16_8_;
    (psVar385->x).n[3] = uVar347 + auStack_648._24_8_;
    puVar378 = (psVar385->x).n + 4;
    *puVar378 = *puVar378 + auStack_648._32_8_;
    (psVar385->x).magnitude = iVar359;
    (psVar385->x).normalized = 0;
    psStack_7a0 = (secp256k1_gej *)0x12532a;
    secp256k1_fe_verify(&psVar385->x);
    psStack_7a0 = (secp256k1_gej *)0x125332;
    secp256k1_fe_verify(&psVar385->x);
    psStack_7a0 = (secp256k1_gej *)0x12533a;
    psVar372 = psVar387;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    iVar359 = auStack_648._40_4_ + (psVar385->x).magnitude;
    if (0x20 < iVar359) goto LAB_00125589;
    uVar1 = (psVar385->x).n[1];
    uVar2 = (psVar385->x).n[2];
    uVar347 = (psVar385->x).n[3];
    psVar387 = (secp256k1_gej *)auStack_648;
    (psVar385->x).n[0] = (psVar385->x).n[0] + auStack_648._0_8_;
    (psVar385->x).n[1] = uVar1 + auStack_648._8_8_;
    (psVar385->x).n[2] = uVar2 + auStack_648._16_8_;
    (psVar385->x).n[3] = uVar347 + auStack_648._24_8_;
    puVar378 = (psVar385->x).n + 4;
    *puVar378 = *puVar378 + auStack_648._32_8_;
    (psVar385->x).magnitude = iVar359;
    (psVar385->x).normalized = 0;
    psStack_7a0 = (secp256k1_gej *)0x12538d;
    secp256k1_fe_verify(&psVar385->x);
    psStack_7a0 = (secp256k1_gej *)0x125395;
    secp256k1_fe_verify((secp256k1_fe *)psVar387);
    psStack_7a0 = (secp256k1_gej *)0x12539d;
    psVar372 = psVar385;
    secp256k1_fe_verify(&psVar385->x);
    iVar359 = (psVar385->x).magnitude + auStack_648._40_4_;
    if (iVar359 < 0x21) {
      auStack_648._0_8_ = (psVar385->x).n[0] + auStack_648._0_8_;
      auStack_648._8_8_ = (psVar385->x).n[1] + auStack_648._8_8_;
      auStack_648._16_8_ = (psVar385->x).n[2] + auStack_648._16_8_;
      auStack_648._24_8_ = (psVar385->x).n[3] + auStack_648._24_8_;
      auStack_648._32_8_ = auStack_648._32_8_ + (psVar385->x).n[4];
      auStack_648._44_4_ = 0;
      psStack_7a0 = (secp256k1_gej *)0x1253f2;
      auStack_648._40_4_ = iVar359;
      secp256k1_fe_verify((secp256k1_fe *)auStack_648);
      psVar387 = (secp256k1_gej *)&psVar385->y;
      psStack_7a0 = (secp256k1_gej *)0x125406;
      secp256k1_fe_mul((secp256k1_fe *)psVar387,(secp256k1_fe *)auStack_648,
                       (secp256k1_fe *)(auStack_768 + 0x30));
      psVar366 = (secp256k1_gej *)auStack_768;
      psStack_7a0 = (secp256k1_gej *)0x12541e;
      psVar382 = psVar366;
      secp256k1_fe_mul((secp256k1_fe *)psVar366,(secp256k1_fe *)psVar366,
                       (secp256k1_fe *)(auStack_708 + 0x30));
      psStack_7a0 = (secp256k1_gej *)0x125426;
      secp256k1_fe_verify((secp256k1_fe *)psVar387);
      psStack_7a0 = (secp256k1_gej *)0x12542e;
      psVar372 = psVar366;
      secp256k1_fe_verify((secp256k1_fe *)psVar366);
      iVar359 = auStack_768._40_4_ + (psVar385->y).magnitude;
      if (iVar359 < 0x21) {
        uVar1 = (psVar385->y).n[1];
        uVar2 = (psVar385->y).n[2];
        uVar347 = (psVar385->y).n[3];
        (psVar385->y).n[0] = (psVar385->y).n[0] + auStack_768._0_8_;
        (psVar385->y).n[1] = uVar1 + auStack_768._8_8_;
        (psVar385->y).n[2] = uVar2 + auStack_768._16_8_;
        (psVar385->y).n[3] = uVar347 + auStack_768._24_8_;
        puVar378 = (psVar385->y).n + 4;
        *puVar378 = *puVar378 + auStack_768._32_8_;
        (psVar385->y).magnitude = iVar359;
        (psVar385->y).normalized = 0;
        psStack_7a0 = (secp256k1_gej *)0x125480;
        secp256k1_fe_verify((secp256k1_fe *)psVar387);
        psStack_7a0 = (secp256k1_gej *)0x125488;
        secp256k1_gej_verify(psVar385);
        return;
      }
      goto LAB_00125593;
    }
  }
  else {
    psStack_7a0 = (secp256k1_gej *)0x125557;
    secp256k1_gej_add_var_cold_14();
LAB_00125557:
    psStack_7a0 = (secp256k1_gej *)0x12555c;
    secp256k1_gej_add_var_cold_13();
LAB_0012555c:
    psStack_7a0 = (secp256k1_gej *)0x125561;
    secp256k1_gej_add_var_cold_12();
LAB_00125561:
    psStack_7a0 = (secp256k1_gej *)0x125566;
    secp256k1_gej_add_var_cold_11();
LAB_00125566:
    psStack_7a0 = (secp256k1_gej *)0x12556b;
    secp256k1_gej_add_var_cold_10();
LAB_0012556b:
    psStack_7a0 = (secp256k1_gej *)0x125570;
    secp256k1_gej_add_var_cold_9();
LAB_00125570:
    psVar388 = psVar386;
    psVar371 = psVar385;
    psStack_7a0 = (secp256k1_gej *)0x125575;
    secp256k1_gej_add_var_cold_8();
LAB_00125575:
    psStack_7a0 = (secp256k1_gej *)0x12557a;
    secp256k1_gej_add_var_cold_7();
LAB_0012557a:
    psVar385 = psVar370;
    psVar350 = psVar388;
    psVar386 = psVar371;
    psStack_7a0 = (secp256k1_gej *)0x12557f;
    secp256k1_gej_add_var_cold_6();
LAB_0012557f:
    psStack_7a0 = (secp256k1_gej *)0x125584;
    secp256k1_gej_add_var_cold_5();
LAB_00125584:
    psStack_7a0 = (secp256k1_gej *)0x125589;
    secp256k1_gej_add_var_cold_4();
LAB_00125589:
    psStack_7a0 = (secp256k1_gej *)0x12558e;
    secp256k1_gej_add_var_cold_3();
  }
  psStack_7a0 = (secp256k1_gej *)0x125593;
  secp256k1_gej_add_var_cold_2();
LAB_00125593:
  psStack_7a0 = (secp256k1_gej *)secp256k1_ecmult_compute_table;
  secp256k1_gej_add_var_cold_1();
  psStack_7c0 = psVar387;
  psStack_7b8 = psVar386;
  psStack_7b0 = psVar350;
  psStack_7a8 = psVar366;
  psStack_7a0 = psVar385;
  memcpy(&sStack_858,psVar382,0x98);
  secp256k1_ge_set_gej_var(&sStack_8c0,&sStack_858);
  secp256k1_ge_to_storage((secp256k1_ge_storage *)psVar372,&sStack_8c0);
  secp256k1_gej_double_var(&sStack_858,psVar382,(secp256k1_fe *)0x0);
  secp256k1_ge_set_gej_var(&sStack_928,&sStack_858);
  lVar376 = 0x40;
  do {
    secp256k1_gej_set_ge(&sStack_858,&sStack_8c0);
    secp256k1_gej_add_ge_var(&sStack_858,&sStack_858,&sStack_928,(secp256k1_fe *)0x0);
    secp256k1_ge_set_gej_var(&sStack_8c0,&sStack_858);
    secp256k1_ge_to_storage((secp256k1_ge_storage *)((long)(psVar372->x).n + lVar376),&sStack_8c0);
    lVar376 = lVar376 + 0x40;
  } while (lVar376 != 0x100);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    secp256k1_fe_verify(x);
    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;
    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    secp256k1_fe_verify(r);
}